

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_a64_insn(CPUARMState_conflict *env,DisasContext_conflict1 *s)

{
  target_ulong *ptVar1;
  byte bVar2;
  abi_ptr addr;
  void *pvVar3;
  uc_struct_conflict2 *val;
  target_ulong val_00;
  hook *phVar4;
  uint64_t pc;
  byte *a1;
  TCGArg a2;
  TCGArg a2_00;
  unsigned_long uVar5;
  TCGv_ptr pTVar6;
  uint8_t **ppuVar7;
  MemOp memop;
  char cVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uintptr_t o_3;
  TCGv_i32 pTVar13;
  TCGv_i64 pTVar14;
  TCGv_i64 pTVar15;
  AArch64DecodeFn *pAVar16;
  undefined7 uVar25;
  TCGLabel *pTVar17;
  TCGTemp *pTVar18;
  TCGContext_conflict1 *pTVar19;
  TCGTemp *pTVar20;
  TCGv_i32 pTVar21;
  TCGv_i32 pTVar22;
  TCGLabel *label;
  int *piVar23;
  bool iss_sf;
  uintptr_t o_7;
  AArch64DecodeFn **ppAVar26;
  uint *a2_01;
  undefined1 *puVar27;
  TCGArg TVar28;
  TCGContext_conflict1 *pTVar29;
  uintptr_t o_8;
  list_item *plVar30;
  undefined8 *puVar31;
  ulong uVar32;
  ulong uVar33;
  TCGv_i32 extraout_RDX;
  TCGContext_conflict1 *extraout_RDX_00;
  TCGContext_conflict1 *pTVar34;
  TCGContext_conflict1 *ret;
  _Bool _Var35;
  a64_shift_type shift_type;
  uintptr_t o_9;
  TCGv_i64 pTVar36;
  TCGv_i32 v;
  code **ppcVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  uintptr_t o_6;
  byte bVar41;
  TCGOpcode TVar42;
  undefined4 uVar43;
  uint64_t pc_00;
  uint64_t pc_01;
  code *pcVar44;
  int64_t val_01;
  uint uVar45;
  uint uVar46;
  uint32_t target_el;
  ulong uVar47;
  TCGTemp **args_00;
  uint uVar48;
  uintptr_t o_26;
  uintptr_t uVar49;
  uint uVar50;
  uint uVar51;
  int iVar52;
  uintptr_t o;
  TCGContext_conflict1 *pTVar53;
  uintptr_t o_1;
  TCGTemp *pTVar54;
  ulong uVar55;
  uint64_t uVar56;
  TCGContext_conflict1 *pTVar57;
  long lVar58;
  int element;
  uintptr_t o_2;
  TCGContext_conflict1 *pTVar59;
  bool bVar60;
  code *pcStack_100;
  undefined1 auStack_f8 [8];
  uintptr_t o_11;
  undefined8 local_e8;
  undefined8 local_e0;
  TCGContext_conflict1 *local_d8;
  TCGContext_conflict1 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  TCGTemp *args [1];
  TCGTemp *local_b0;
  ulong local_88;
  char local_80;
  uint local_78;
  uint local_70;
  TCGContext_conflict1 *local_58;
  TCGTemp *local_50;
  TCGContext_conflict1 *local_48;
  TCGTemp *local_40;
  char *pcVar24;
  
  puVar40 = auStack_f8;
  ppcVar37 = (code **)auStack_f8;
  puVar38 = auStack_f8;
  puVar27 = auStack_f8;
  addr = (s->base).pc_next;
  s->pc_curr = addr;
  iVar52 = s->sctlr_b;
  pcStack_100 = (code *)0x69b72c;
  uVar9 = cpu_ldl_code_aarch64(env,addr);
  uVar10 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  if (iVar52 == 0) {
    uVar10 = uVar9;
  }
  s->insn = uVar10;
  ptVar1 = &(s->base).pc_next;
  *ptVar1 = *ptVar1 + 4;
  uVar55 = s->pc_curr;
  for (plVar30 = env->uc->hook[2].head; plVar30 != (list_item *)0x0; plVar30 = plVar30->next) {
    pvVar3 = plVar30->data;
    if ((((*(ulong *)((long)pvVar3 + 0x18) <= uVar55) && (uVar55 <= *(ulong *)((long)pvVar3 + 0x20))
         ) || (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))) &&
       (*(char *)((long)pvVar3 + 0x14) != '\x01')) break;
  }
  local_d0 = (TCGContext_conflict1 *)(ulong)uVar10;
  if (plVar30 != (list_item *)0x0) {
    pTVar57 = env->uc->tcg_ctx;
    pcStack_100 = (code *)0x69b7ae;
    tcg_gen_op2_aarch64(pTVar57,INDEX_op_movi_i64,(TCGArg)(pTVar57->cpu_pc_arm64 + (long)pTVar57),
                        uVar55);
    val = env->uc;
    val_00 = s->pc_curr;
    pcStack_100 = (code *)0x69b7d0;
    o_11 = (uintptr_t)env;
    local_d8 = (TCGContext_conflict1 *)s;
    pTVar13 = tcg_const_i32_aarch64(pTVar57,4);
    pcStack_100 = (code *)0x69b7de;
    pTVar14 = tcg_const_i64_aarch64(pTVar57,(int64_t)val);
    pcStack_100 = (code *)0x69b7ec;
    pTVar15 = tcg_const_i64_aarch64(pTVar57,val_00);
    local_e0 = (code *)(pTVar14 + (long)pTVar57);
    pTVar54 = (TCGTemp *)(pTVar15 + (long)pTVar57);
    pTVar59 = (TCGContext_conflict1 *)(pTVar13 + (long)pTVar57);
    local_40 = (TCGTemp *)0x0;
    local_e8 = pTVar59;
    local_58 = (TCGContext_conflict1 *)local_e0;
    local_50 = pTVar54;
    local_48 = pTVar59;
    if (val->hooks_count[2] == 1) {
      for (plVar30 = val->hook[2].head; plVar30 != (list_item *)0x0; plVar30 = plVar30->next) {
        phVar4 = (hook *)plVar30->data;
        if (phVar4->to_delete == false) {
          pcStack_100 = (code *)0x69b856;
          pTVar14 = tcg_const_i64_aarch64(pTVar57,(int64_t)phVar4->user_data);
          pcStack_100 = (code *)0x69b87b;
          local_40 = (TCGTemp *)(pTVar14 + (long)pTVar57);
          (*val->add_inline_hook)(val,phVar4,&local_58,4);
          pcStack_100 = (code *)0x69b886;
          tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar14 + (long)pTVar57));
        }
      }
    }
    else {
      pcStack_100 = (code *)0x69b899;
      pTVar13 = tcg_const_i32_aarch64(pTVar57,2);
      local_b0 = (TCGTemp *)(pTVar13 + (long)pTVar57);
      pcStack_100 = (code *)0x69b8c7;
      args[0] = (TCGTemp *)pTVar59;
      tcg_gen_callN_aarch64(pTVar57,helper_uc_tracecode,(TCGTemp *)0x0,4,args);
      pcStack_100 = (code *)0x69b8d2;
      tcg_temp_free_internal_aarch64(pTVar57,local_b0);
    }
    pcStack_100 = (code *)0x69b8dd;
    tcg_temp_free_internal_aarch64(pTVar57,pTVar54);
    pcStack_100 = (code *)0x69b8ea;
    tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)local_e0);
    pcStack_100 = (code *)0x69b8f7;
    tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)local_e8);
    pcStack_100 = (code *)0x69b8ff;
    check_exit_request_aarch64(pTVar57);
    s = (DisasContext_conflict1 *)local_d8;
    env = (CPUARMState_conflict *)o_11;
  }
  pTVar57 = local_d0;
  *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 0;
  lVar58 = *(long *)&((TCGContext_conflict1 *)s)->nb_labels;
  uVar10 = (uint)local_d0;
  if (((*(byte *)(lVar58 + 0x60) & 0xf) != 0) &&
     (*(int *)((long)&((TCGContext_conflict1 *)s)->pool_current + 4) == 1)) {
    uVar48 = (uint)((TCGContext_conflict1 *)s)->current_frame_offset;
    uVar45 = uVar48 & 0xf;
    uVar33 = (ulong)(uVar45 << 4);
    uVar47 = (ulong)((TCGContext_conflict1 *)s)->pool_end >>
             ((byte)env->uc->init_target_page->bits & 0x3f) &
             *(ulong *)((long)env + (uVar33 - 0xd0)) >> 6;
    uVar55 = *(ulong *)(*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x290) + 8);
    if (((uVar55 | 0x200) & *(ulong *)(*(long *)((long)env + (uVar33 - 200)) + 0x10 + uVar47 * 0x40)
        ) == ((ulong)((TCGContext_conflict1 *)s)->pool_end & uVar55)) {
      bVar41 = (*(byte *)(*(long *)((long)env + (ulong)uVar45 * 0x2b8 + -0x1ec0) + 10 +
                         (uVar47 & 0xffffffff) * 0x10) & 0x10) >> 4;
    }
    else {
      bVar41 = 0;
    }
    *(byte *)((long)&((TCGContext_conflict1 *)s)->code_gen_buffer_size + 1) = bVar41;
    bVar2 = (byte)((TCGContext_conflict1 *)s)->code_gen_buffer_size;
    if ((bVar2 != 0) && (bVar41 != 0)) {
      uVar45 = (uint)bVar2;
      if ((uVar10 & 0xfffff01f) == 0xd503201f) {
        uVar46 = (uint)((ulong)local_d0 >> 5) & 0x7f;
        if (uVar46 < 0x22) {
          if ((uVar46 != 0x19) && (uVar46 != 0x1b)) goto LAB_0069bf8c;
          bVar41 = *(byte *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 6) ^ 1 |
                   uVar45 != 3;
        }
        else {
          if (uVar46 == 0x22) {
            bVar60 = uVar45 == 3;
          }
          else {
            if (uVar46 != 0x24) {
              if (uVar46 != 0x26) goto LAB_0069bf8c;
              goto LAB_0069ba6d;
            }
            bVar60 = uVar45 == 2;
          }
          bVar41 = !bVar60;
        }
      }
      else {
        bVar41 = ((uVar10 & 0xffe0001f) + 0x2be00000 & 0xffc0001f) == 0;
      }
      if (bVar41 == 0) {
LAB_0069bf8c:
        uVar56._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
        uVar56._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
        if ((uVar48 != 0x17) ||
           (uVar9 = 3, *(char *)((long)&((TCGContext_conflict1 *)s)->frame_end + 4) == '\0')) {
          uVar9 = 1;
          if (1 < (int)*(uint32_t *)&((TCGContext_conflict1 *)s)->code_gen_epilogue) {
            uVar9 = *(uint32_t *)&((TCGContext_conflict1 *)s)->code_gen_epilogue;
          }
        }
        pcStack_100 = (code *)0x69bfc9;
        gen_exception_insn(s,uVar56,1,uVar45 | 0x34000000,uVar9);
        return;
      }
    }
  }
LAB_0069ba6d:
  uVar45 = (uint)((ulong)local_d0 >> 0x19);
  uVar46 = uVar45 & 0x7f;
  uVar48 = (uint)((ulong)local_d0 >> 0x10);
  puVar39 = auStack_f8;
  pTVar59 = (TCGContext_conflict1 *)o_11;
  pTVar53 = (TCGContext_conflict1 *)s;
  switch(uVar45 & 0xf) {
  case 0:
  case 1:
  case 3:
    goto switchD_0069ba86_caseD_0;
  case 2:
    if ((*(byte *)(lVar58 + 0x5c) & 0xf) != 0) {
      pcStack_100 = (code *)0x69c075;
      _Var35 = disas_sve_aarch64(s,uVar10);
      puVar27 = auStack_f8;
      if (_Var35) goto LAB_006a0109;
    }
    goto switchD_0069e0a5_caseD_82;
  default:
    uVar55._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
    uVar55._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
    uVar5 = ((TCGContext_conflict1 *)s)->free_temps[1].l[1];
    for (puVar31 = *(undefined8 **)(uVar5 + 0x418); puVar31 != (undefined8 *)0x0;
        puVar31 = (undefined8 *)*puVar31) {
      lVar58 = puVar31[1];
      if ((((*(ulong *)(lVar58 + 0x18) <= uVar55) && (uVar55 <= *(ulong *)(lVar58 + 0x20))) ||
          (*(ulong *)(lVar58 + 0x20) < *(ulong *)(lVar58 + 0x18))) &&
         (*(char *)(lVar58 + 0x14) != '\x01')) break;
    }
    if (puVar31 != (undefined8 *)0x0) {
LAB_0069bbff:
      pTVar57 = *(TCGContext_conflict1 **)(uVar5 + 0x2e8);
      pcStack_100 = (code *)0x69bc1a;
      tcg_gen_op2_aarch64(pTVar57,INDEX_op_movi_i64,(TCGArg)(pTVar57->cpu_pc_arm64 + (long)pTVar57),
                          uVar55);
    }
    else {
      for (puVar31 = *(undefined8 **)(uVar5 + 0x430); puVar31 != (undefined8 *)0x0;
          puVar31 = (undefined8 *)*puVar31) {
        lVar58 = puVar31[1];
        if ((((*(ulong *)(lVar58 + 0x18) <= uVar55) && (uVar55 <= *(ulong *)(lVar58 + 0x20))) ||
            (*(ulong *)(lVar58 + 0x20) < *(ulong *)(lVar58 + 0x18))) &&
           (*(char *)(lVar58 + 0x14) != '\x01')) break;
      }
      if (puVar31 != (undefined8 *)0x0) goto LAB_0069bbff;
    }
    pTVar57 = local_d0;
    uVar48 = (uint)local_d0;
    uVar10 = (uint)((ulong)local_d0 >> 0x18) & 0x3f;
    local_78 = (uint)((ulong)local_d0 >> 0x10);
    pTVar59 = (TCGContext_conflict1 *)o_11;
    if (0x17 < uVar10) {
      if (0x3d < uVar10) {
LAB_0069c8d1:
        if (uVar10 == 0x18) {
LAB_0069c8fc:
          pTVar57 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          uVar10 = (uint)((ulong)local_d0 >> 0x1e);
          uVar45 = uVar10 & 3;
          if ((uVar48 >> 0x1a & 1) == 0) {
            puVar27 = auStack_f8;
            if (uVar45 == 3) goto LAB_006a0109;
            uVar45 = uVar10 & 1;
            _Var35 = (_Bool)((byte)((ulong)local_d0 >> 0x1f) & 1);
          }
          else {
            puVar39 = auStack_f8;
            if (uVar45 == 3) goto switchD_0069ba86_caseD_0;
            if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_006a1871;
            *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
            target_el = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
            ppcVar37 = (code **)auStack_f8;
            if (target_el != 0) goto LAB_0069fb28;
            _Var35 = false;
          }
          uVar10 = uVar48 & 0x1f;
          pcStack_100 = (code *)0x69cd3c;
          o_11 = (uintptr_t)cpu_reg_aarch64(s,uVar10);
          pcStack_100 = (code *)0x69cd51;
          pTVar14 = tcg_const_i64_aarch64
                              (pTVar57,(long)(int)((int)(uVar48 << 8) >> 0xb & 0xfffffffc) +
                                       *(long *)&((TCGContext_conflict1 *)s)->nb_temps);
          if (((uint)local_d0 >> 0x1a & 1) == 0) {
            do_gpr_ld_memidx(s,(TCGv_i64)o_11,pTVar14,uVar45 + 2,_Var35,false,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,true,
                             uVar10,0x3fffffff < (uint)local_d0,false);
          }
          else {
            pcStack_100 = (code *)0x69d645;
            do_fp_ld(s,uVar10,pTVar14,uVar45 + 2);
          }
          pTVar59 = (TCGContext_conflict1 *)(pTVar14 + (long)pTVar57);
LAB_0069d64e:
          pcStack_100 = (code *)0x69d653;
          tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)pTVar59);
          puVar27 = auStack_f8;
          goto LAB_006a0109;
        }
        puVar39 = auStack_f8;
        if ((uVar10 == 0x19) && (puVar39 = auStack_f8, ((ulong)local_d0 & 0x200c00) == 0)) {
          pcStack_100 = (code *)0x69c8f7;
          disas_ldst_ldapr_stlr(s,uVar48);
          puVar27 = auStack_f8;
          goto LAB_006a0109;
        }
        goto switchD_0069ba86_caseD_0;
      }
      if ((0x330000000000U >> uVar10 & 1) != 0) {
        uVar10 = (uint)((ulong)local_d0 >> 0x1e) & 3;
        puVar39 = auStack_f8;
        if (uVar10 == 3) goto switchD_0069ba86_caseD_0;
        pTVar57 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        if ((uVar48 >> 0x1a & 1) == 0) {
          puVar39 = auStack_f8;
          if ((uVar48 & 0x40400000) == 0x40000000) goto switchD_0069ba86_caseD_0;
          uVar10 = (uint)((ulong)local_d0 >> 0x1f) & 1;
          _Var35 = (_Bool)((byte)((ulong)local_d0 >> 0x1e) & 1);
        }
        else {
          _Var35 = false;
        }
        uVar45 = (uint)((ulong)local_d0 >> 0x17) & 3;
        uVar25 = (undefined7)
                 ((ulong)((long)&switchD_0069ccd6::switchdataD_00d824ec +
                         (long)(int)(&switchD_0069ccd6::switchdataD_00d824ec)[uVar45]) >> 8);
        switch(uVar45) {
        case 0:
          puVar39 = auStack_f8;
          if (_Var35 != false) goto switchD_0069ba86_caseD_0;
        case 2:
          uVar43 = 0;
LAB_0069d335:
          local_80 = '\0';
          break;
        case 1:
          uVar43 = (undefined4)CONCAT71(uVar25,1);
          local_80 = '\x01';
          break;
        case 3:
          uVar43 = (undefined4)CONCAT71(uVar25,1);
          goto LAB_0069d335;
        }
        if ((uVar48 >> 0x1a & 1) != 0) {
          if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_006a1871;
          *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
          target_el = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
          ppcVar37 = (code **)auStack_f8;
          if (target_el != 0) goto LAB_0069fb28;
        }
        local_e0 = (code *)CONCAT44(local_e0._4_4_,uVar43);
        uVar55 = (ulong)local_d0 >> 10;
        uVar10 = uVar10 + 2;
        pTVar59 = (TCGContext_conflict1 *)(ulong)uVar10;
        local_c8 = (TCGv_i64)((((long)local_d0 << 0x2a) >> 0x39) << (sbyte)uVar10);
        local_88 = (ulong)local_d0 >> 5 & 0x1f;
        pcStack_100 = (code *)0x69d3a5;
        local_c0 = pTVar59;
        o_11 = (uintptr_t)read_cpu_reg_sp_aarch64(s,(uint)((ulong)local_d0 >> 5) & 0x1f,1);
        if (local_80 == '\0') {
          pcStack_100 = (code *)0x69d3c9;
          tcg_gen_addi_i64_aarch64(pTVar57,(TCGv_i64)o_11,(TCGv_i64)o_11,(int64_t)local_c8);
        }
        a2_01 = (uint *)local_d0;
        uVar48 = (uint)local_d0;
        uVar45 = uVar48 & 0x1f;
        uVar9 = (uint)uVar55 & 0x1f;
        pcStack_100 = (code *)0x69d3e9;
        local_e8 = pTVar57;
        pTVar19 = (TCGContext_conflict1 *)clean_data_tbi(s,(TCGv_i64)o_11);
        if ((uVar48 >> 0x1a & 1) == 0) {
          pcStack_100 = (code *)0x69d406;
          pTVar14 = cpu_reg_aarch64(s,uVar45);
          pcStack_100 = (code *)0x69d415;
          pTVar59 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar9);
          pTVar57 = local_e8;
          if ((uVar48 >> 0x16 & 1) == 0) {
            do_gpr_st_memidx(s,pTVar14,(TCGv_i64)pTVar19,uVar10,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,false,0,
                             false,false);
            pcStack_100 = (code *)0x69d46d;
            tcg_gen_addi_i64_aarch64
                      (local_e8,(TCGv_i64)pTVar19,(TCGv_i64)pTVar19,1L << ((byte)local_c0 & 0x3f));
            do_gpr_st_memidx(s,(TCGv_i64)pTVar59,(TCGv_i64)pTVar19,uVar10,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,false,0,
                             false,false);
          }
          else {
            pcStack_100 = (code *)0x69dd46;
            local_d0 = pTVar59;
            pTVar54 = tcg_temp_new_internal_aarch64(local_e8,TCG_TYPE_I64,false);
            pTVar15 = (TCGv_i64)((long)pTVar54 - (long)pTVar57);
            do_gpr_ld_memidx(s,pTVar15,(TCGv_i64)pTVar19,uVar10,_Var35,false,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,false,0,
                             false,false);
            pcStack_100 = (code *)0x69ddad;
            tcg_gen_addi_i64_aarch64
                      (pTVar57,(TCGv_i64)pTVar19,(TCGv_i64)pTVar19,1L << ((byte)local_c0 & 0x3f));
            do_gpr_ld_memidx(s,(TCGv_i64)local_d0,(TCGv_i64)pTVar19,uVar10,_Var35,false,
                             (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,false,0,
                             false,false);
            if (pTVar14 != pTVar15) {
              pcStack_100 = (code *)0x69de0e;
              tcg_gen_op2_aarch64(pTVar57,INDEX_op_mov_i64,(TCGArg)(pTVar14 + (long)pTVar57),
                                  (TCGArg)pTVar54);
            }
            pcStack_100 = (code *)0x69de1c;
            tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar15 + (long)pTVar57));
          }
        }
        else {
LAB_0069d49c:
          iVar52 = (int)pTVar59;
          if (((uint)a2_01 >> 0x16 & 1) == 0) {
            pcStack_100 = (code *)0x69d4b9;
            do_fp_st((DisasContext_conflict1 *)pTVar53,uVar45,(TCGv_i64)pTVar19,iVar52);
          }
          else {
            pcStack_100 = (code *)0x69de26;
            do_fp_ld((DisasContext_conflict1 *)pTVar53,uVar45,(TCGv_i64)pTVar19,iVar52);
          }
          pcStack_100 = (code *)0x69de46;
          tcg_gen_addi_i64_aarch64
                    (local_e8,(TCGv_i64)pTVar19,(TCGv_i64)pTVar19,1L << ((byte)local_c0 & 0x3f));
          s = (DisasContext_conflict1 *)pTVar53;
          if (((uint)local_d0 >> 0x16 & 1) == 0) {
            pcStack_100 = (code *)0x69de5e;
            do_fp_st((DisasContext_conflict1 *)pTVar53,uVar9,(TCGv_i64)pTVar19,iVar52);
          }
          else {
            pcStack_100 = (code *)0x69de70;
            do_fp_ld((DisasContext_conflict1 *)pTVar53,uVar9,(TCGv_i64)pTVar19,iVar52);
          }
        }
        puVar27 = auStack_f8;
        if ((char)local_e0 == '\0') goto LAB_006a0109;
        if (local_80 != '\0') {
          pcStack_100 = (code *)0x69dea0;
          tcg_gen_addi_i64_aarch64(local_e8,(TCGv_i64)o_11,(TCGv_i64)o_11,(int64_t)local_c8);
        }
        pTVar14 = ((uc_struct_conflict2 *)((TCGContext_conflict1 *)s)->free_temps[1].l[1])->tcg_ctx
                  ->cpu_X[local_88 & 0xffffffff];
        puVar27 = auStack_f8;
        if (pTVar14 == (TCGv_i64)o_11) goto LAB_006a0109;
        pTVar14 = (TCGv_i64)((long)&local_e8->pool_cur + (long)pTVar14);
        pTVar57 = (TCGContext_conflict1 *)o_11;
LAB_0069ded5:
        puVar27 = (undefined1 *)((long)&local_e8->pool_cur + (long)&pTVar57->pool_cur);
        pTVar57 = local_e8;
        goto LAB_0069dee0;
      }
      if ((0x3300000000000000U >> uVar10 & 1) == 0) {
        if (uVar10 != 0x1c) goto LAB_0069c8d1;
        goto LAB_0069c8fc;
      }
      uVar33 = (ulong)(uVar48 & 0x1f);
      uVar55 = (ulong)local_d0 >> 0x16;
      uVar10 = (uint)uVar55;
      uVar45 = uVar10 & 3;
      uVar46 = (uint)((ulong)local_d0 >> 0x1e) & 3;
      if (((ushort)((ulong)local_d0 >> 0x18) & 3) == 1) {
        pTVar57 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        if ((uVar48 >> 0x1a & 1) == 0) {
          puVar27 = auStack_f8;
          o_11 = uVar33;
          if (uVar45 == 2 && uVar46 == 3) goto LAB_006a0109;
          if (-1 < (int)uVar48 || uVar45 != 3) {
            local_e8 = (TCGContext_conflict1 *)
                       (CONCAT44(local_e8._4_4_,(int)((ulong)local_d0 >> 0x17)) & 0xffffffff00000001
                       );
            if (uVar46 == 3) {
              local_e0 = (code *)((ulong)local_e0._4_4_ << 0x20);
            }
            else {
              local_e0 = (code *)(CONCAT44(local_e0._4_4_,uVar10) & 0xffffffff00000001);
            }
LAB_0069eb03:
            uVar55 = (ulong)local_d0 >> 10;
            pcStack_100 = (code *)0x69eb28;
            o_11 = uVar33;
            pTVar14 = read_cpu_reg_sp_aarch64(s,(uint)((ulong)local_d0 >> 5) & 0x1f,1);
            pcStack_100 = (code *)0x69eb41;
            tcg_gen_addi_i64_aarch64
                      (pTVar57,pTVar14,pTVar14,(ulong)(((uint)uVar55 & 0xfff) << (sbyte)uVar46));
            pcStack_100 = (code *)0x69eb4c;
            pTVar14 = clean_data_tbi(s,pTVar14);
            uVar10 = (uint)local_d0;
            uVar48 = (uint)o_11;
            if ((uVar10 >> 0x1a & 1) != 0) {
              if (uVar45 == 0) {
                pcStack_100 = (code *)0x69f01c;
                do_fp_st(s,uVar48,pTVar14,uVar46);
                puVar27 = auStack_f8;
              }
              else {
                pcStack_100 = (code *)0x69eb76;
                do_fp_ld(s,uVar48,pTVar14,uVar46);
                puVar27 = auStack_f8;
              }
              goto LAB_006a0109;
            }
            pcStack_100 = (code *)0x69eb8a;
            pTVar15 = cpu_reg_aarch64(s,uVar48);
            bVar60 = uVar46 == 3;
            if (SUB81(local_e8,0) != false) {
              bVar60 = (uVar10 >> 0x16 & 1) == 0;
            }
            uVar10 = (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf;
            if (uVar45 != 0) {
              do_gpr_ld_memidx(s,pTVar15,pTVar14,uVar46,SUB81(local_e8,0),local_e0._0_1_,uVar10,true
                               ,uVar48,bVar60,false);
              puVar27 = auStack_f8;
              goto LAB_006a0109;
            }
            do_gpr_st_memidx(s,pTVar15,pTVar14,uVar46,uVar10,true,uVar48,bVar60,false);
            goto LAB_0069f041;
          }
        }
        else {
          uVar46 = uVar46 + (uVar10 & 2) * 2;
          if (uVar46 < 5) {
            if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_006a1871;
            *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
            uVar9 = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
            if (uVar9 == 0) {
              uVar45 = uVar10 & 1;
              local_e8 = (TCGContext_conflict1 *)((ulong)local_e8._4_4_ << 0x20);
              local_e0 = (code *)((ulong)local_e0._4_4_ << 0x20);
              goto LAB_0069eb03;
            }
LAB_0069c8bc:
            pc_01._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
            pc_01._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
            goto LAB_0069db13;
          }
        }
        goto LAB_0069d60b;
      }
      puVar39 = auStack_f8;
      if (((ulong)local_d0 & 0x3000000) != 0) goto switchD_0069ba86_caseD_0;
      uVar47 = (ulong)local_d0 >> 10;
      uVar11 = (uint)(uVar47 & 0x3fffff);
      if ((uVar48 >> 0x15 & 1) == 0) {
        uVar11 = uVar11 & 3;
        bVar60 = (uVar48 >> 0x1a & 1) == 0;
        pTVar57 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        if (bVar60) {
          if (uVar45 == 2 && uVar46 == 3) {
            puVar27 = auStack_f8;
            if ((uVar47 & 3) == 0) goto LAB_006a0109;
            goto switchD_0069e0a5_caseD_82;
          }
          puVar39 = auStack_f8;
          if (-1 < (int)uVar48 || uVar45 != 3) {
            bVar41 = (uVar55 & 3) == 0;
            local_88._0_1_ = (_Bool)((byte)((ulong)local_d0 >> 0x17) & 1);
            if (uVar46 == 3) {
              _Var35 = false;
            }
            else {
              _Var35 = (_Bool)((byte)uVar55 & 1);
            }
            goto LAB_0069f643;
          }
        }
        else {
          uVar46 = uVar46 + (uVar10 & 2) * 2;
          puVar39 = auStack_f8;
          if (uVar11 != 2 && uVar46 < 5) {
            if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_006a1871;
            *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
            target_el = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
            ppcVar37 = (code **)auStack_f8;
            if (target_el != 0) goto LAB_0069fb28;
            bVar41 = (byte)uVar45 ^ 1;
            _Var35 = false;
            local_88._0_1_ = false;
LAB_0069f643:
            uVar10 = (uint)((ulong)local_d0 >> 5);
            local_c0 = (TCGContext_conflict1 *)CONCAT44(local_c0._4_4_,(int)(uVar48 << 0xb) >> 0x17)
            ;
            local_c8 = (TCGv_i64)(CONCAT44(local_c8._4_4_,uVar10) & 0xffffffff0000001f);
            pcStack_100 = (code *)0x69f674;
            o_11 = uVar33;
            local_e0 = (code *)pTVar57;
            local_e8 = (TCGContext_conflict1 *)read_cpu_reg_sp_aarch64(s,uVar10 & 0x1f,1);
            if ((2U >> uVar11 & 1) == 0) {
              pcStack_100 = (code *)0x69f698;
              tcg_gen_addi_i64_aarch64
                        ((TCGContext_conflict1 *)local_e0,(TCGv_i64)local_e8,(TCGv_i64)local_e8,
                         (long)(int)(MemOp)local_c0);
            }
            pcStack_100 = (code *)0x69f6a5;
            pTVar14 = clean_data_tbi(s,(TCGv_i64)local_e8);
            iVar52 = (int)o_11;
            if (((uint)local_d0 >> 0x1a & 1) == 0) {
              pcStack_100 = (code *)0x69f6e7;
              pTVar15 = cpu_reg_aarch64(s,iVar52);
              uVar10 = (uint)((TCGContext_conflict1 *)s)->current_frame_offset;
              if ((uVar11 == 2) &&
                 (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 4) == '\x01'))
              {
                uVar10 = uVar10 - 0x12;
                if ((7 < uVar10) || ((0xdbU >> (uVar10 & 0x1f) & 1) == 0)) {
                  pcStack_100 = reset_btype;
                  g_assertion_message_expr
                            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                             ,0x84,(char *)0x0);
                }
                uVar10 = *(uint *)(&DAT_00d83c08 + (ulong)uVar10 * 4);
              }
              iss_sf = uVar46 == 3;
              if (local_88._0_1_ != false) {
                iss_sf = ((uint)local_d0 >> 0x16 & 1) == 0;
              }
              if ((bVar41 & 1) == 0) {
                do_gpr_ld_memidx(s,pTVar15,pTVar14,uVar46,local_88._0_1_,_Var35,uVar10 & 0xf,bVar60,
                                 (uint)o_11,iss_sf,false);
              }
              else {
                do_gpr_st_memidx(s,pTVar15,pTVar14,uVar46,uVar10 & 0xf,bVar60,(uint)o_11,iss_sf,
                                 false);
              }
            }
            else if ((bVar41 & 1) == 0) {
              pcStack_100 = (code *)0x69f759;
              do_fp_ld(s,iVar52,pTVar14,uVar46);
            }
            else {
              pcStack_100 = (code *)0x69f6cd;
              do_fp_st(s,iVar52,pTVar14,uVar46);
            }
            puVar27 = auStack_f8;
            if ((uVar47 & 1) != 0) {
              pTVar57 = *(TCGContext_conflict1 **)
                         (*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8) +
                          0xaeb0 + ((ulong)local_c8 & 0xffffffff) * 8);
              if ((2U >> (sbyte)uVar11 & 1) != 0) {
                pcStack_100 = (code *)0x69f83d;
                tcg_gen_addi_i64_aarch64
                          ((TCGContext_conflict1 *)local_e0,(TCGv_i64)local_e8,(TCGv_i64)local_e8,
                           (long)(int)(MemOp)local_c0);
              }
              puVar27 = auStack_f8;
              if (pTVar57 != local_e8) {
                pcStack_100 = (code *)0x69f86b;
                tcg_gen_op2_aarch64((TCGContext_conflict1 *)local_e0,INDEX_op_mov_i64,
                                    (TCGArg)((long)&((TCGContext_conflict1 *)local_e0)->pool_cur +
                                            (long)&pTVar57->pool_cur),
                                    (TCGArg)((long)&((TCGContext_conflict1 *)local_e0)->pool_cur +
                                            (long)&local_e8->pool_cur));
                puVar27 = auStack_f8;
              }
            }
            goto LAB_006a0109;
          }
        }
        goto switchD_0069ba86_caseD_0;
      }
      pTVar59 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      if (((ushort)(uVar47 & 0x3fffff) & 3) == 2) {
        if ((uVar48 >> 0xe & 1) != 0) {
          if ((uVar48 >> 0x1a & 1) == 0) {
            puVar27 = auStack_f8;
            o_11 = uVar33;
            local_e8 = pTVar59;
            if (uVar45 == 2 && uVar46 == 3) goto LAB_006a0109;
            if (-1 < (int)uVar48 || uVar45 != 3) {
              local_c0 = (TCGContext_conflict1 *)
                         (CONCAT44(local_c0._4_4_,(int)((ulong)local_d0 >> 0x17)) &
                         0xffffffff00000001);
              if (uVar46 == 3) {
                local_c8 = (TCGv_i64)((ulong)local_c8._4_4_ << 0x20);
              }
              else {
                local_c8 = (TCGv_i64)(CONCAT44(local_c8._4_4_,uVar10) & 0xffffffff00000001);
              }
              goto LAB_006a0604;
            }
          }
          else {
            uVar46 = uVar46 + (uVar10 & 2) * 2;
            if (uVar46 < 5) {
              if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01')
              goto LAB_006a1871;
              *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
              uVar9 = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
              if (uVar9 != 0) goto LAB_0069c8bc;
              uVar45 = uVar10 & 1;
              local_c8 = (TCGv_i64)((ulong)local_c8._4_4_ << 0x20);
              local_c0 = (TCGContext_conflict1 *)((ulong)local_c0 & 0xffffffff00000000);
LAB_006a0604:
              uVar55 = (ulong)local_d0 >> 0xd;
              pcStack_100 = (code *)0x6a0633;
              o_11 = uVar33;
              local_e8 = pTVar59;
              local_e0 = (code *)read_cpu_reg_sp_aarch64(s,(uint)((ulong)local_d0 >> 5) & 0x1f,1);
              pcStack_100 = (code *)0x6a0648;
              pTVar14 = read_cpu_reg_aarch64(s,local_78 & 0x1f,1);
              pTVar57 = local_e8;
              pcStack_100 = (code *)0x6a0674;
              ext_and_shift_reg(local_e8,pTVar14,pTVar14,(uint)uVar55 & 7,
                                ((int)local_d0 << 0x13) >> 0x1f & uVar46);
              pTVar59 = (TCGContext_conflict1 *)local_e0;
              TVar28 = (long)&pTVar57->pool_cur +
                       (long)&((TCGContext_conflict1 *)local_e0)->pool_cur;
              pcStack_100 = (code *)0x6a0693;
              tcg_gen_op3_aarch64(pTVar57,INDEX_op_add_i64,TVar28,TVar28,
                                  (TCGArg)(pTVar14 + (long)pTVar57));
              pcStack_100 = (code *)0x6a069e;
              pTVar14 = clean_data_tbi(s,(TCGv_i64)pTVar59);
              uVar10 = (uint)local_d0;
              uVar48 = (uint)o_11;
              if ((uVar10 >> 0x1a & 1) == 0) {
                pcStack_100 = (code *)0x6a06dc;
                pTVar15 = cpu_reg_aarch64(s,uVar48);
                bVar60 = uVar46 == 3;
                if (SUB81(local_c0,0) != false) {
                  bVar60 = (uVar10 >> 0x16 & 1) == 0;
                }
                uVar10 = (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf;
                if (uVar45 == 0) {
                  do_gpr_st_memidx(s,pTVar15,pTVar14,uVar46,uVar10,true,uVar48,bVar60,false);
                  puVar27 = auStack_f8;
                }
                else {
                  do_gpr_ld_memidx(s,pTVar15,pTVar14,uVar46,SUB81(local_c0,0),local_c8._0_1_,uVar10,
                                   true,uVar48,bVar60,false);
                  puVar27 = auStack_f8;
                }
              }
              else if (uVar45 == 0) {
                pcStack_100 = (code *)0x6a0bb9;
                do_fp_st(s,uVar48,pTVar14,uVar46);
                puVar27 = auStack_f8;
              }
              else {
                pcStack_100 = (code *)0x6a06c8;
                do_fp_ld(s,uVar48,pTVar14,uVar46);
                puVar27 = auStack_f8;
              }
              goto LAB_006a0109;
            }
          }
        }
        goto switchD_0069d1d9_caseD_9;
      }
      if ((uVar47 & 3) != 0) {
        if ((uVar46 != 3 || ((ulong)local_d0 & 0x4000000) != 0) ||
           ((*(uint *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x50) & 0xff000ff0) == 0))
        goto switchD_0069d1d9_caseD_9;
        uVar10 = (uint)((ulong)local_d0 >> 5) & 0x1f;
        pcStack_100 = (code *)0x69dfaa;
        o_11 = uVar33;
        local_e8 = pTVar59;
        local_e0 = (code *)read_cpu_reg_sp_aarch64(s,uVar10,1);
        if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
          args[0] = (TCGTemp *)(local_e8->cpu_env + (long)local_e8);
          if ((uVar48 >> 0x17 & 1) == 0) {
            pcVar44 = helper_autda_aarch64;
          }
          else {
            pcVar44 = helper_autdb_aarch64;
          }
          pcStack_100 = (code *)0x6a019b;
          tcg_gen_callN_aarch64
                    (local_e8,pcVar44,
                     (TCGTemp *)
                     ((long)&((TCGContext_conflict1 *)local_e0)->pool_cur +
                     (long)&local_e8->pool_cur),3,args);
          pTVar57 = local_d0;
        }
        pTVar59 = (TCGContext_conflict1 *)local_e0;
        pcStack_100 = (code *)0x6a01df;
        tcg_gen_addi_i64_aarch64
                  (local_e8,(TCGv_i64)local_e0,(TCGv_i64)local_e0,
                   (long)((ulong)((uint)((ulong)pTVar57 >> 9) & 0xff8 | uVar11 & 0x1000) << 0x33) >>
                   0x33);
        pcStack_100 = (code *)0x6a01ea;
        pTVar14 = clean_data_tbi(s,(TCGv_i64)pTVar59);
        pcStack_100 = (code *)0x6a01fd;
        uVar48 = (uint)o_11;
        pTVar15 = cpu_reg_aarch64(s,uVar48);
        do_gpr_ld_memidx(s,pTVar15,pTVar14,3,false,false,
                         (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,
                         ((uint)pTVar57 >> 0xb & 1) == 0,uVar48,true,false);
        puVar27 = auStack_f8;
        if ((((uint)pTVar57 >> 0xb & 1) == 0) ||
           (pTVar57 = *(TCGContext_conflict1 **)
                       (*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8) + 0xaeb0
                       + (ulong)uVar10 * 8), puVar27 = auStack_f8,
           pTVar57 == (TCGContext_conflict1 *)local_e0)) goto LAB_006a0109;
        pTVar14 = (TCGv_i64)((long)&local_e8->pool_cur + (long)&pTVar57->pool_cur);
        pTVar57 = (TCGContext_conflict1 *)local_e0;
        goto LAB_0069ded5;
      }
      if ((((uVar48 >> 0x1a & 1) != 0) ||
          ((*(byte *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x4a) & 0xf0) == 0)) ||
         (uVar10 = (uint)((ulong)local_d0 >> 0xc) & 0xf, 0xc < uVar10))
      goto switchD_0069d1d9_caseD_9;
      o_11 = uVar33;
      switch(uVar10) {
      case 0:
        local_e0 = tcg_gen_atomic_fetch_add_i64_aarch64;
        break;
      case 1:
        local_e0 = tcg_gen_atomic_fetch_and_i64_aarch64;
        break;
      case 2:
        local_e0 = tcg_gen_atomic_fetch_xor_i64_aarch64;
        break;
      case 3:
        local_e0 = tcg_gen_atomic_fetch_or_i64_aarch64;
        break;
      case 4:
        local_e0 = tcg_gen_atomic_fetch_smax_i64_aarch64;
        break;
      case 5:
        local_e0 = tcg_gen_atomic_fetch_smin_i64_aarch64;
        break;
      case 6:
        local_e0 = tcg_gen_atomic_fetch_umax_i64_aarch64;
        break;
      case 7:
        local_e0 = tcg_gen_atomic_fetch_umin_i64_aarch64;
        break;
      case 8:
        local_e0 = tcg_gen_atomic_xchg_i64_aarch64;
        break;
      default:
        goto switchD_0069d1d9_caseD_9;
      case 0xc:
        if ((((uVar48 & 0xc00000) == 0x800000) && ((local_78 & 0x1f) == 0x1f)) &&
           ((*(ulong *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x50) & 0xf00000) != 0))
        break;
        goto switchD_0069d1d9_caseD_9;
      }
      pcStack_100 = (code *)0x6a0889;
      local_e8 = pTVar59;
      pTVar59 = (TCGContext_conflict1 *)clean_data_tbi(s,pTVar59->cpu_X[uVar48 >> 5 & 0x1f]);
      pTVar57 = local_e8;
      if (uVar10 == 0xc) {
        pcStack_100 = (code *)0x6a08a2;
        uVar10 = (uint)o_11;
        pTVar14 = cpu_reg_aarch64(s,uVar10);
        do_gpr_ld_memidx(s,pTVar14,(TCGv_i64)pTVar59,uVar46,false,false,
                         (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,true,uVar10,
                         uVar46 == 3,true);
        pcStack_100 = (code *)0x6a08f3;
        tcg_gen_mb_aarch64(local_e8,TCG_BAR_LDAQ|TCG_MO_ALL);
        puVar27 = auStack_f8;
      }
      else {
        pcStack_100 = (code *)0x6a0912;
        local_d0 = pTVar59;
        pTVar14 = read_cpu_reg_aarch64(s,local_78 & 0x1f,1);
        if (uVar10 == 1) {
          pcStack_100 = (code *)0x6a0929;
          tcg_gen_not_i64_aarch64(pTVar57,pTVar14,pTVar14);
        }
        pcStack_100 = (code *)0x6a0936;
        pTVar15 = cpu_reg_aarch64(s,(int)o_11);
        pcStack_100 = (code *)0x6a095b;
        (*local_e0)(pTVar57,pTVar15,local_d0,pTVar14,
                    (uint)((TCGContext_conflict1 *)s)->current_frame_offset & 0xf,
                    uVar46 | ((TCGContext_conflict1 *)s)->reserved_regs | 0x70);
        puVar27 = auStack_f8;
      }
      goto LAB_006a0109;
    }
    if (uVar10 == 8) {
      (*(code *)(&DAT_00d824fc +
                *(int *)(&DAT_00d824fc +
                        (ulong)((uint)((ulong)local_d0 >> 0x14) & 0xe |
                               (uint)((ulong)local_d0 >> 0xf) & 1) * 4)))
                (*(undefined8 *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8));
      return;
    }
    if (uVar10 != 0xc) {
      puVar39 = auStack_f8;
      if (((uVar10 != 0xd) || (puVar39 = auStack_f8, (int)uVar48 < 0)) ||
         (puVar39 = auStack_f8,
         ((ulong)local_d0 & 0x1f0000) != 0 && ((ulong)local_d0 >> 0x17 & 1) == 0))
      goto switchD_0069ba86_caseD_0;
      uVar49 = *(uintptr_t *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar10 = (uint)((ulong)local_d0 >> 10) & 3;
      pTVar29 = (TCGContext_conflict1 *)(ulong)uVar10;
      uVar55 = (ulong)local_d0 >> 0xc;
      uVar33 = (ulong)local_d0 >> 0x16;
      uVar45 = (uint)((ulong)local_d0 >> 0x1b) & 8;
      local_c8 = (TCGv_i64)(ulong)uVar45;
      uVar45 = uVar45 + ((uint)uVar55 & 1) * 4;
      uVar10 = uVar45 + uVar10;
      uVar46 = (uint)((ulong)local_d0 >> 0xe) & 3;
      switch(uVar46) {
      case 0:
        bVar60 = false;
        pTVar29 = (TCGContext_conflict1 *)(ulong)uVar46;
LAB_0069e252:
        if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') goto LAB_006a1871;
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        target_el = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
        ppcVar37 = (code **)auStack_f8;
        if (target_el != 0) goto LAB_0069fb28;
        local_70 = local_78 & 0x1f;
        uVar48 = (uint)((ulong)local_d0 >> 0x15) & 1;
        uVar45 = (uint)uVar55 & 2;
        pTVar14 = *(TCGv_i64 *)(uVar49 + 0xaeb0 + (ulong)((uint)((ulong)local_d0 >> 5) & 0x1f) * 8);
        pcStack_100 = (code *)0x69e2d6;
        o_11 = uVar49;
        local_e8 = pTVar29;
        local_d8 = (TCGContext_conflict1 *)s;
        pTVar59 = (TCGContext_conflict1 *)clean_data_tbi(s,pTVar14);
        pcStack_100 = (code *)0x69e2e6;
        pTVar15 = tcg_const_i64_aarch64
                            ((TCGContext_conflict1 *)o_11,(ulong)(uint)(1 << (sbyte)pTVar29));
        local_c8 = (TCGv_i64)(ulong)((int)local_c8 + 8);
        local_c0 = (TCGContext_conflict1 *)((long)&pTVar59->pool_cur + o_11);
        pTVar54 = (TCGTemp *)(pTVar15 + o_11);
        iVar52 = uVar48 + uVar45 + 1;
        uVar55 = (ulong)pTVar57 & 0xffffffff;
        pTVar57 = (TCGContext_conflict1 *)o_11;
        local_e0 = (code *)pTVar59;
        do {
          uVar46 = (uint)uVar55 & 0x1f;
          if (bVar60) {
            pcStack_100 = (code *)0x69e340;
            pTVar20 = tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I64,false);
            pTVar59 = local_d8;
            pTVar15 = (TCGv_i64)((long)pTVar20 - (long)pTVar57);
            uVar11 = (uint)local_e8;
            pcStack_100 = (code *)0x69e373;
            tcg_gen_qemu_ld_i64_aarch64
                      ((TCGContext_conflict1 *)o_11,pTVar15,(TCGv_i64)local_e0,
                       (ulong)((uint)local_d8->current_frame_offset & 0xf),
                       local_d8->reserved_regs + uVar11);
            pTVar57 = (TCGContext_conflict1 *)o_11;
            pcStack_100 = (code *)0x69e39f;
            tcg_gen_gvec_dup_i64_aarch64
                      ((TCGContext_conflict1 *)o_11,uVar11,uVar46 * 0x100 + 0xc10,(uint32_t)local_c8
                       ,(uint32_t)pTVar59->frame_end,pTVar15);
            pcStack_100 = (code *)0x69e3b2;
            tcg_temp_free_internal_aarch64(pTVar57,pTVar20);
          }
          else if ((uVar33 & 1) == 0) {
            pcStack_100 = (code *)0x69e3d9;
            do_vec_st((DisasContext_conflict1 *)local_d8,uVar46,uVar10,(TCGv_i64)local_e0,
                      (int)local_e8,local_d8->reserved_regs);
          }
          else {
            pcStack_100 = (code *)0x69e3f0;
            do_vec_ld((DisasContext_conflict1 *)local_d8,uVar46,uVar10,(TCGv_i64)local_e0,
                      (int)local_e8,local_d8->reserved_regs);
          }
          pcStack_100 = (code *)0x69e408;
          tcg_gen_op3_aarch64(pTVar57,INDEX_op_add_i64,(TCGArg)local_c0,(TCGArg)local_c0,
                              (TCGArg)pTVar54);
          uVar55 = (ulong)(uVar46 + 1);
          iVar52 = iVar52 + -1;
        } while (iVar52 != 0);
        pcStack_100 = (code *)0x69e41e;
        tcg_temp_free_internal_aarch64(pTVar57,pTVar54);
        pTVar57 = local_d8;
        puVar27 = auStack_f8;
        s = (DisasContext_conflict1 *)local_d8;
        if (((uint)local_d0 >> 0x17 & 1) == 0) goto LAB_006a0109;
        if (local_70 == 0x1f) {
          uVar10 = uVar45 + uVar48 + 1 << ((byte)local_e8 & 0x1f);
          goto LAB_0069f567;
        }
        pcStack_100 = (code *)0x69fcb2;
        pTVar15 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,local_70);
        goto LAB_006a04e6;
      case 1:
        puVar39 = auStack_f8;
        if ((uVar48 >> 10 & 1) == 0) {
          uVar10 = uVar10 >> 1;
          pTVar29 = (TCGContext_conflict1 *)&DAT_00000001;
LAB_0069e24f:
          bVar60 = false;
          goto LAB_0069e252;
        }
        break;
      case 2:
        puVar39 = auStack_f8;
        if ((uVar48 >> 0xb & 1) == 0) {
          if ((uVar48 >> 10 & 1) == 0) {
            uVar10 = uVar45 >> 2;
            bVar60 = false;
            pTVar29 = (TCGContext_conflict1 *)&DAT_00000002;
            goto LAB_0069e252;
          }
          puVar39 = auStack_f8;
          if ((uVar55 & 1) == 0) {
            uVar10 = (uint)((ulong)local_d0 >> 0x1e) & 3;
            pTVar29 = (TCGContext_conflict1 *)0x3;
            goto LAB_0069e24f;
          }
        }
        break;
      case 3:
        bVar60 = true;
        puVar39 = auStack_f8;
        if (((byte)uVar33 & (uVar55 & 1) == 0) != 0) goto LAB_0069e252;
      }
      goto switchD_0069ba86_caseD_0;
    }
    puVar39 = auStack_f8;
    if (((((ulong)local_d0 & 0x80200000) != 0) ||
        (puVar39 = auStack_f8,
        ((ulong)local_d0 & 0x1f0000) != 0 && ((ulong)local_d0 >> 0x17 & 1) == 0)) ||
       (uVar55 = ((ulong)local_d0 & 0xffff) >> 0xc, puVar39 = auStack_f8, 10 < (ushort)uVar55))
    goto switchD_0069ba86_caseD_0;
    pTVar59 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    iVar52 = 1;
    puVar39 = auStack_f8;
    switch(uVar55) {
    case 0:
      local_c8 = (TCGv_i64)0x4;
      goto LAB_0069f329;
    default:
      goto switchD_0069ba86_caseD_0;
    case 2:
      local_c8 = (TCGv_i64)&DAT_00000001;
      bVar60 = true;
      iVar52 = 4;
      break;
    case 4:
      local_c8 = (TCGv_i64)0x3;
      goto LAB_0069f329;
    case 6:
      local_c8 = (TCGv_i64)&DAT_00000001;
      bVar60 = true;
      iVar52 = 3;
      break;
    case 7:
      bVar60 = true;
      local_c8 = (TCGv_i64)&DAT_00000001;
      break;
    case 8:
      local_c8 = (TCGv_i64)&DAT_00000002;
LAB_0069f329:
      bVar60 = false;
      break;
    case 10:
      local_c8 = (TCGv_i64)&DAT_00000001;
      bVar60 = true;
      iVar52 = 2;
    }
    uVar10 = (uint)((ulong)local_d0 >> 10) & 3;
    puVar39 = auStack_f8;
    if ((uVar10 == 3 && ((ulong)local_d0 & 0x40000000) == 0) && !bVar60) {
switchD_0069ba86_caseD_0:
      o_11 = (uintptr_t)pTVar59;
      puVar40 = puVar39;
LAB_006a0101:
      *(undefined8 *)(puVar40 + -8) = 0x6a0106;
      unallocated_encoding_aarch64(s);
      puVar27 = puVar40;
    }
    else {
      o_11 = (uintptr_t)pTVar59;
      if ((char)((TCGContext_conflict1 *)s)->initial_buffer_size == '\x01') {
LAB_006a1871:
        pcStack_100 = (code *)0x6a1890;
        __assert_fail("!s->fp_access_checked",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                      ,0x487,"_Bool fp_access_check(DisasContext *)");
      }
      *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
      target_el = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
      ppcVar37 = (code **)auStack_f8;
      if (target_el == 0) {
        local_78 = local_78 & 0x1f;
        uVar48 = ((TCGContext_conflict1 *)s)->reserved_regs;
        if (((ulong)local_d0 >> 10 & 3) == 0) {
          uVar48 = uVar10;
        }
        local_e0 = (code *)CONCAT44(local_e0._4_4_,uVar48);
        uVar45 = 3;
        if (uVar48 != 0) {
          uVar45 = uVar10;
        }
        if (!bVar60) {
          uVar45 = uVar10;
        }
        local_e8 = (TCGContext_conflict1 *)CONCAT44(local_e8._4_4_,uVar45);
        uVar10 = ((uint)((ulong)local_d0 >> 0x1b) & 8) + 8 >> (sbyte)uVar45;
        pTVar14 = pTVar59->cpu_X[(uint)((ulong)local_d0 >> 5) & 0x1f];
        pcStack_100 = (code *)0x69f408;
        local_d8 = (TCGContext_conflict1 *)s;
        pTVar15 = clean_data_tbi(s,pTVar14);
        pcStack_100 = (code *)0x69f416;
        pTVar36 = tcg_const_i64_aarch64(pTVar59,(ulong)(uint)(1 << (sbyte)uVar45));
        iVar12 = 0;
        local_c0 = (TCGContext_conflict1 *)CONCAT44(local_c0._4_4_,(int)local_d0);
        do {
          element = 0;
          do {
            uVar55 = (ulong)local_c8 & 0xffffffff;
            uVar48 = (MemOp)local_c0;
            do {
              if (((uint)local_d0 >> 0x16 & 1) == 0) {
                pcStack_100 = (code *)0x69f477;
                do_vec_st((DisasContext_conflict1 *)local_d8,uVar48 & 0x1f,element,pTVar15,
                          (int)local_e8,(MemOp)local_e0);
              }
              else {
                pcStack_100 = (code *)0x69f493;
                do_vec_ld((DisasContext_conflict1 *)local_d8,uVar48 & 0x1f,element,pTVar15,
                          (int)local_e8,(MemOp)local_e0);
              }
              pcStack_100 = (code *)0x69f4ab;
              tcg_gen_op3_aarch64((TCGContext_conflict1 *)o_11,INDEX_op_add_i64,
                                  (TCGArg)(pTVar15 + (long)pTVar59),
                                  (TCGArg)(pTVar15 + (long)pTVar59),
                                  (TCGArg)(pTVar36 + (long)pTVar59));
              pTVar57 = local_d0;
              uVar48 = uVar48 + 1;
              uVar45 = (int)uVar55 - 1;
              uVar55 = (ulong)uVar45;
            } while (uVar45 != 0);
            element = element + 1;
          } while (element != uVar10 + (uVar10 == 0));
          iVar12 = iVar12 + 1;
          local_c0 = (TCGContext_conflict1 *)CONCAT44(local_c0._4_4_,(MemOp)local_c0 + 1);
        } while (iVar12 != iVar52);
        pcStack_100 = (code *)0x69f4e5;
        tcg_temp_free_internal_aarch64
                  ((TCGContext_conflict1 *)o_11,(TCGTemp *)(pTVar36 + (long)pTVar59));
        s = (DisasContext_conflict1 *)local_d8;
        if (((uint)pTVar57 >> 0x16 & 1) != 0) {
          iVar12 = (int)local_c8 * iVar52;
          uVar55 = (ulong)local_d0 >> 0x1e;
          uVar33 = (ulong)local_d0 & 0xffffffff;
          do {
            pcStack_100 = (code *)0x69f51c;
            clear_vec_high(s,(_Bool)((byte)uVar55 & 1),(uint)uVar33 & 0x1f);
            uVar33 = (ulong)((uint)uVar33 + 1);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        pTVar57 = local_d8;
        puVar27 = auStack_f8;
        if (((uint)local_d0 >> 0x17 & 1) != 0) {
          if (local_78 == 0x1f) {
            uVar10 = (int)local_c8 * iVar52 * uVar10 << ((byte)local_e8 & 0x1f);
LAB_0069f567:
            pcStack_100 = (code *)0x69f572;
            tcg_gen_addi_i64_aarch64((TCGContext_conflict1 *)o_11,pTVar14,pTVar14,(ulong)uVar10);
            puVar27 = auStack_f8;
            s = (DisasContext_conflict1 *)local_d8;
          }
          else {
            pcStack_100 = (code *)0x6a04d9;
            pTVar15 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,local_78);
LAB_006a04e6:
            pcStack_100 = (code *)0x6a04fa;
            tcg_gen_op3_aarch64((TCGContext_conflict1 *)o_11,INDEX_op_add_i64,
                                (TCGArg)(pTVar14 + o_11),(TCGArg)(pTVar14 + o_11),
                                (TCGArg)(pTVar15 + o_11));
            puVar27 = auStack_f8;
            s = (DisasContext_conflict1 *)pTVar57;
          }
        }
      }
      else {
LAB_0069fb28:
        pTVar54 = *(TCGTemp **)&pTVar53->nb_temps;
        iVar52 = 1;
        uVar9 = 0x1fe0000a;
        puVar38 = (undefined1 *)ppcVar37;
        s = (DisasContext_conflict1 *)pTVar53;
LAB_0069fb39:
        *(undefined8 *)(puVar38 + -8) = 0x69fb3e;
        gen_exception_insn(s,(uint64_t)pTVar54,iVar52,uVar9,target_el);
        puVar27 = puVar38;
      }
    }
    goto LAB_006a0109;
  case 5:
  case 0xd:
    uVar55 = (ulong)local_d0 >> 0x15;
    uVar46 = (uint)uVar55;
    uVar33 = (ulong)local_d0 >> 10;
    uVar11 = (uint)uVar33;
    uVar50 = uVar11 & 0x3f;
    if ((uVar10 >> 0x1c & 1) == 0) {
      if ((uVar10 >> 0x18 & 1) != 0) {
        uVar45 = uVar10 & 0x1f;
        uVar49 = *(uintptr_t *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        if ((uVar10 >> 0x15 & 1) == 0) {
          shift_type = (a64_shift_type)((ulong)local_d0 >> 0x16) & A64_SHIFT_TYPE_ROR;
          pcStack_100 = (code *)0x69c293;
          local_d8 = (TCGContext_conflict1 *)s;
          pTVar59 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar45);
          pTVar57 = local_d8;
          if ((shift_type != A64_SHIFT_TYPE_ROR) && ((int)uVar10 < 0 || uVar50 < 0x20)) {
            uVar48 = (uint)local_d0;
            uVar55 = (ulong)local_d0 >> 0x10;
            uVar10 = (uint)((ulong)local_d0 >> 0x1f) & 1;
            pcStack_100 = (code *)0x69c2e4;
            o_11 = uVar49;
            local_e8 = pTVar59;
            local_e0 = (code *)read_cpu_reg_aarch64
                                         ((DisasContext_conflict1 *)local_d8,
                                          (uint)((ulong)local_d0 >> 5) & 0x1f,uVar10);
            pTVar29 = (TCGContext_conflict1 *)o_11;
            pcStack_100 = (code *)0x69c2fb;
            pTVar14 = read_cpu_reg_aarch64
                                ((DisasContext_conflict1 *)pTVar57,(uint)uVar55 & 0x1f,uVar10);
            pcStack_100 = (code *)0x69c315;
            shift_reg_imm(pTVar29,pTVar14,pTVar14,uVar10,shift_type,uVar50);
            pcStack_100 = (code *)0x69c324;
            pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
            pTVar53 = (TCGContext_conflict1 *)((long)pTVar54 - (long)pTVar29);
            if ((uVar48 >> 0x1d & 1) == 0) {
              if ((uVar48 >> 0x1e & 1) == 0) {
                pcStack_100 = (code *)0x69c361;
                tcg_gen_op3_aarch64(pTVar29,INDEX_op_add_i64,(TCGArg)pTVar54,
                                    (long)&((TCGContext_conflict1 *)local_e0)->pool_cur +
                                    (long)pTVar29,(TCGArg)(pTVar14 + (long)pTVar29));
              }
              else {
                pcStack_100 = (code *)0x69e4f1;
                tcg_gen_sub_i64(pTVar29,(TCGv_i64)pTVar53,(TCGv_i64)local_e0,pTVar14);
              }
            }
            else if ((uVar48 >> 0x1e & 1) == 0) {
              pcStack_100 = (code *)0x69d91f;
              gen_add_CC(pTVar29,uVar10,(TCGv_i64)pTVar53,(TCGv_i64)local_e0,pTVar14);
            }
            else {
              pcStack_100 = (code *)0x69e500;
              gen_sub_CC(pTVar29,uVar10,(TCGv_i64)pTVar53,(TCGv_i64)local_e0,pTVar14);
            }
            pTVar57 = local_e8;
            if (-1 < (int)(uint)local_d0) goto LAB_0069e512;
            if (local_e8 != pTVar53) {
              puVar27 = (undefined1 *)((long)&local_e8->pool_cur + (long)pTVar29);
              goto LAB_0069e52f;
            }
            goto LAB_0069e534;
          }
        }
        else {
          local_d8 = (TCGContext_conflict1 *)s;
          if (((ulong)local_d0 & 0xc00000) == 0 && (uVar11 & 7) < 5) {
            uVar55 = (ulong)local_d0 >> 5;
            uVar33 = (ulong)local_d0 >> 0xd;
            if ((uVar10 >> 0x1d & 1) == 0) {
              local_e8 = *(TCGContext_conflict1 **)(uVar49 + 0xaeb0 + (ulong)uVar45 * 8);
              o_11 = uVar49;
            }
            else {
              pcStack_100 = (code *)0x69d83f;
              o_11 = uVar49;
              local_e8 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar45);
            }
            uVar45 = (uint)((ulong)local_d0 >> 0x1f) & 1;
            pcStack_100 = (code *)0x69d85c;
            local_e0 = (code *)read_cpu_reg_sp_aarch64(s,(uint)uVar55 & 0x1f,uVar45);
            pcStack_100 = (code *)0x69d86e;
            pTVar14 = read_cpu_reg_aarch64(s,uVar48 & 0x1f,uVar45);
            pTVar29 = (TCGContext_conflict1 *)o_11;
            pcStack_100 = (code *)0x69d88a;
            ext_and_shift_reg((TCGContext_conflict1 *)o_11,pTVar14,pTVar14,(uint)uVar33 & 7,
                              uVar11 & 7);
            pcStack_100 = (code *)0x69d899;
            pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
            pTVar57 = (TCGContext_conflict1 *)((long)pTVar54 - (long)pTVar29);
            uVar10 = (uint)local_d0;
            if ((uVar10 >> 0x1d & 1) == 0) {
              if ((uVar10 >> 0x1e & 1) == 0) {
                pcStack_100 = (code *)0x69d8d5;
                tcg_gen_op3_aarch64(pTVar29,INDEX_op_add_i64,(TCGArg)pTVar54,
                                    (long)&((TCGContext_conflict1 *)local_e0)->pool_cur +
                                    (long)pTVar29,(TCGArg)(pTVar14 + (long)pTVar29));
              }
              else {
                pcStack_100 = (code *)0x69e490;
                tcg_gen_sub_i64(pTVar29,(TCGv_i64)pTVar57,(TCGv_i64)local_e0,pTVar14);
              }
            }
            else if ((uVar10 >> 0x1e & 1) == 0) {
              pcStack_100 = (code *)0x69d8f9;
              gen_add_CC(pTVar29,uVar45,(TCGv_i64)pTVar57,(TCGv_i64)local_e0,pTVar14);
            }
            else {
              pcStack_100 = (code *)0x69e49f;
              gen_sub_CC(pTVar29,uVar45,(TCGv_i64)pTVar57,(TCGv_i64)local_e0,pTVar14);
            }
            if ((int)(uint)local_d0 < 0) {
              if (local_e8 != pTVar57) {
                pcStack_100 = (code *)0x69e4d3;
                tcg_gen_op2_aarch64(pTVar29,INDEX_op_mov_i64,
                                    (long)&local_e8->pool_cur + (long)pTVar29,(TCGArg)pTVar54);
              }
            }
            else {
              pcStack_100 = (code *)0x69e4b9;
              tcg_gen_ext32u_i64_aarch64(pTVar29,(TCGv_i64)local_e8,(TCGv_i64)pTVar57);
            }
            pTVar54 = (TCGTemp *)((long)&pTVar57->pool_cur + (long)pTVar29);
            goto LAB_0069e53d;
          }
        }
        goto switchD_0069bff9_caseD_1;
      }
      local_d8 = (TCGContext_conflict1 *)s;
      if ((uVar10 & 0x80008000) == 0x8000) goto switchD_0069bff9_caseD_1;
      pTVar57 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      local_e8 = (TCGContext_conflict1 *)(ulong)((uint)((ulong)local_d0 >> 0x1d) & 3);
      uVar47 = (ulong)local_d0 >> 0x16;
      uVar45 = (uint)((ulong)local_d0 >> 5) & 0x1f;
      pcStack_100 = (code *)0x69bb9c;
      o_11 = (uintptr_t)cpu_reg_aarch64(s,uVar10 & 0x1f);
      s = (DisasContext_conflict1 *)local_d8;
      local_e0 = (code *)pTVar57;
      if (((uVar45 != 0x1f) || ((int)local_e8 != 1)) || ((uVar33 & 0x3f) != 0 || (uVar47 & 3) != 0))
      {
        uVar10 = (uint)((ulong)local_d0 >> 0x1f) & 1;
        pcStack_100 = (code *)0x69d2a9;
        pTVar14 = read_cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar48 & 0x1f,uVar10);
        if ((uVar33 & 0x3f) != 0) {
          pcStack_100 = (code *)0x69d2ca;
          shift_reg_imm((TCGContext_conflict1 *)local_e0,pTVar14,pTVar14,uVar10,
                        (a64_shift_type)uVar47 & A64_SHIFT_TYPE_ROR,uVar50);
        }
        pcStack_100 = (code *)0x69d2d6;
        cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar45);
        (*(code *)(&DAT_00d8245c +
                  *(int *)(&DAT_00d8245c + (ulong)((int)local_e8 + (uVar46 & 1) * 4) * 4)))();
        return;
      }
      pcStack_100 = (code *)0x69bbd5;
      pTVar59 = (TCGContext_conflict1 *)
                cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar48 & 0x1f);
      if ((uVar55 & 1) != 0) {
        pcStack_100 = (code *)0x69d812;
        tcg_gen_not_i64_aarch64(pTVar57,(TCGv_i64)o_11,(TCGv_i64)pTVar59);
        pTVar57 = (TCGContext_conflict1 *)local_e0;
        pTVar53 = (TCGContext_conflict1 *)o_11;
        iVar52 = (uint)local_d0;
        goto joined_r0x0069f603;
      }
      pTVar53 = (TCGContext_conflict1 *)o_11;
      if (-1 < (int)(uint)local_d0) goto LAB_006a0323;
      puVar27 = auStack_f8;
      s = (DisasContext_conflict1 *)local_d8;
      if ((TCGContext_conflict1 *)o_11 == pTVar59) goto LAB_006a0109;
      pTVar14 = (TCGv_i64)((long)&((TCGContext_conflict1 *)local_e0)->pool_cur + o_11);
      puVar27 = (undefined1 *)
                ((long)&((TCGContext_conflict1 *)local_e0)->pool_cur + (long)&pTVar59->pool_cur);
      pTVar57 = (TCGContext_conflict1 *)local_e0;
LAB_0069dee0:
      pcStack_100 = (code *)0x69dee5;
      tcg_gen_op2_aarch64(pTVar57,INDEX_op_mov_i64,(TCGArg)pTVar14,(TCGArg)puVar27);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    }
    uVar46 = uVar46 & 0xf;
    local_d8 = (TCGContext_conflict1 *)s;
    if (0xf < (ushort)uVar46) goto switchD_0069bff9_caseD_1;
    break;
  case 7:
  case 0xf:
    if ((uVar10 & 0x50000000) != 0x10000000) {
      uVar48 = 0x9f200400;
      ppAVar26 = &data_proc_simd[0].disas_fn;
      pAVar16 = (AArch64DecodeFn *)0x0;
      do {
        if ((uVar48 & uVar10) == ((AArch64DecodeTable *)(ppAVar26 + -1))->pattern) {
          pAVar16 = *ppAVar26;
          break;
        }
        uVar48 = *(uint *)((long)ppAVar26 + 0xc);
        ppAVar26 = ppAVar26 + 2;
      } while (uVar48 != 0);
      puVar39 = auStack_f8;
      if (pAVar16 != (AArch64DecodeFn *)0x0) {
        pcStack_100 = (code *)0x69c255;
        (*pAVar16)(s,uVar10);
        puVar27 = auStack_f8;
        goto LAB_006a0109;
      }
      goto switchD_0069ba86_caseD_0;
    }
    if ((uVar10 >> 0x18 & 1) != 0) {
      puVar39 = auStack_f8;
      if (0x1fffffff < uVar10) goto switchD_0069ba86_caseD_0;
      uVar45 = (uint)((ulong)local_d0 >> 5) & 0x1f;
      uVar46 = (uint)((ulong)local_d0 >> 10) & 0x1f;
      uVar48 = uVar48 & 0x1f;
      switch((uint)((ulong)local_d0 >> 0x16) & 3) {
      case 0:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar9 = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
        if (uVar9 == 0) {
          o_11 = CONCAT44(o_11._4_4_,uVar10) & 0xffffffff0000001f;
          pTVar57 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          pcStack_100 = (code *)0x69c3ec;
          local_e8 = (TCGContext_conflict1 *)
                     tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I32,false);
          pcStack_100 = (code *)0x69c400;
          pTVar54 = tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I64,false);
          local_e0 = (code *)((long)pTVar54 - (long)pTVar57);
          pcStack_100 = (code *)0x69c41f;
          tcg_gen_addi_i64_aarch64(pTVar57,(TCGv_i64)local_e0,(TCGv_i64)pTVar57->cpu_env,0x2ec8);
          pcStack_100 = (code *)0x69c42a;
          pTVar13 = read_fp_sreg(s,uVar45);
          pcStack_100 = (code *)0x69c438;
          local_c0 = (TCGContext_conflict1 *)read_fp_sreg(s,uVar48);
          pcStack_100 = (code *)0x69c448;
          pTVar21 = read_fp_sreg(s,uVar46);
          if (((uint)local_d0 >> 0x15 & 1) != 0) {
            args[0] = (TCGTemp *)(pTVar21 + (long)pTVar57);
            pcStack_100 = (code *)0x69c476;
            tcg_gen_callN_aarch64(pTVar57,helper_vfp_negs_aarch64,args[0],1,args);
          }
          if ((short)local_d0 < 0 != (bool)((byte)((ulong)local_d0 >> 0x15) & 1)) {
            args[0] = (TCGTemp *)(pTVar13 + (long)&pTVar57->pool_cur);
            pcStack_100 = (code *)0x69c4af;
            tcg_gen_callN_aarch64(pTVar57,helper_vfp_negs_aarch64,args[0],1,args);
          }
          pTVar22 = (TCGv_i32)((long)local_e8 - (long)pTVar57);
          local_d0 = (TCGContext_conflict1 *)(pTVar13 + (long)pTVar57);
          pTVar18 = (TCGTemp *)((long)&pTVar57->pool_cur + (long)&local_c0->pool_cur);
          pTVar54 = (TCGTemp *)(pTVar21 + (long)pTVar57);
          pTVar20 = (TCGTemp *)
                    ((long)&pTVar57->pool_cur + (long)&((TCGContext_conflict1 *)local_e0)->pool_cur)
          ;
          pcStack_100 = (code *)0x69c500;
          args[0] = (TCGTemp *)local_d0;
          tcg_gen_callN_aarch64(pTVar57,helper_vfp_muladds_aarch64,(TCGTemp *)local_e8,4,args);
          pcStack_100 = (code *)0x69c50f;
          write_fp_sreg(s,(uint)o_11,pTVar22);
LAB_0069e98c:
          pcStack_100 = (code *)0x69e997;
          tcg_temp_free_internal_aarch64(pTVar57,pTVar20);
          pcStack_100 = (code *)0x69e9a4;
          tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)local_d0);
          pcStack_100 = (code *)0x69e9af;
          tcg_temp_free_internal_aarch64(pTVar57,pTVar18);
          pcStack_100 = (code *)0x69e9ba;
          tcg_temp_free_internal_aarch64(pTVar57,pTVar54);
          pcStack_100 = (code *)0x69e9c7;
          tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)local_e8);
          puVar27 = auStack_f8;
          goto LAB_006a0109;
        }
        break;
      case 1:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar9 = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
        if (uVar9 == 0) {
          o_11 = CONCAT44(o_11._4_4_,uVar10) & 0xffffffff0000001f;
          pTVar57 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          pcStack_100 = (code *)0x69e869;
          local_e8 = (TCGContext_conflict1 *)
                     tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I64,false);
          pcStack_100 = (code *)0x69e87d;
          pTVar54 = tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I64,false);
          local_e0 = (code *)((long)pTVar54 - (long)pTVar57);
          pcStack_100 = (code *)0x69e89c;
          tcg_gen_addi_i64_aarch64(pTVar57,(TCGv_i64)local_e0,(TCGv_i64)pTVar57->cpu_env,0x2ec8);
          pcStack_100 = (code *)0x69e8a7;
          pTVar14 = read_fp_dreg(s,uVar45);
          pcStack_100 = (code *)0x69e8b5;
          local_c0 = (TCGContext_conflict1 *)read_fp_dreg(s,uVar48);
          pcStack_100 = (code *)0x69e8c5;
          pTVar15 = read_fp_dreg(s,uVar46);
          if (((uint)local_d0 >> 0x15 & 1) != 0) {
            args[0] = (TCGTemp *)(pTVar15 + (long)pTVar57);
            pcStack_100 = (code *)0x69e8f3;
            tcg_gen_callN_aarch64(pTVar57,helper_vfp_negd_aarch64,args[0],1,args);
          }
          if ((short)local_d0 < 0 != (bool)((byte)((ulong)local_d0 >> 0x15) & 1)) {
            args[0] = (TCGTemp *)(pTVar14 + (long)&pTVar57->pool_cur);
            pcStack_100 = (code *)0x69e92c;
            tcg_gen_callN_aarch64(pTVar57,helper_vfp_negd_aarch64,args[0],1,args);
          }
          pTVar36 = (TCGv_i64)((long)local_e8 - (long)pTVar57);
          local_d0 = (TCGContext_conflict1 *)(pTVar14 + (long)pTVar57);
          pTVar18 = (TCGTemp *)((long)&pTVar57->pool_cur + (long)&local_c0->pool_cur);
          pTVar54 = (TCGTemp *)(pTVar15 + (long)pTVar57);
          pTVar20 = (TCGTemp *)
                    ((long)&pTVar57->pool_cur + (long)&((TCGContext_conflict1 *)local_e0)->pool_cur)
          ;
          pcStack_100 = (code *)0x69e97d;
          args[0] = (TCGTemp *)local_d0;
          tcg_gen_callN_aarch64(pTVar57,helper_vfp_muladdd_aarch64,(TCGTemp *)local_e8,4,args);
          pcStack_100 = (code *)0x69e98c;
          write_fp_dreg_aarch64(s,(uint)o_11,pTVar36);
          goto LAB_0069e98c;
        }
        break;
      case 2:
switchD_0069c3b4_caseD_2:
        pcStack_100 = (code *)0x69da92;
        unallocated_encoding_aarch64(s);
        puVar27 = auStack_f8;
        goto LAB_006a0109;
      case 3:
        if ((*(uint *)(lVar58 + 0x58) & 0xf0000) != 0x10000) goto switchD_0069c3b4_caseD_2;
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar9 = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
        if (uVar9 != 0) {
          pc._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
          pc._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
          pcStack_100 = (code *)0x69da85;
          gen_exception_insn(s,pc,1,0x1fe0000a,uVar9);
          puVar27 = auStack_f8;
          goto LAB_006a0109;
        }
        o_11 = CONCAT44(o_11._4_4_,uVar10) & 0xffffffff0000001f;
        pTVar57 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69f070;
        local_d8 = (TCGContext_conflict1 *)s;
        local_e8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I32,false)
        ;
        pcStack_100 = (code *)0x69f084;
        pTVar54 = tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I64,false);
        local_e0 = (code *)((long)pTVar54 - (long)pTVar57);
        pcStack_100 = (code *)0x69f0a3;
        tcg_gen_addi_i64_aarch64(pTVar57,(TCGv_i64)local_e0,(TCGv_i64)pTVar57->cpu_env,0x2ed0);
        pcStack_100 = (code *)0x69f0ae;
        pTVar13 = read_fp_hreg(s,uVar45);
        pcStack_100 = (code *)0x69f0bc;
        pTVar21 = read_fp_hreg(s,uVar48);
        pcStack_100 = (code *)0x69f0ca;
        pTVar22 = read_fp_hreg(s,uVar46);
        if (((uint)local_d0 >> 0x15 & 1) != 0) {
          pcStack_100 = (code *)0x69f0eb;
          tcg_gen_xori_i32_aarch64(pTVar57,pTVar22,pTVar22,0x8000);
        }
        if ((short)local_d0 < 0 != (bool)((byte)((ulong)local_d0 >> 0x15) & 1)) {
          pcStack_100 = (code *)0x69f115;
          tcg_gen_xori_i32_aarch64(pTVar57,pTVar13,pTVar13,0x8000);
        }
        v = (TCGv_i32)((long)local_e8 - (long)pTVar57);
        local_d0 = (TCGContext_conflict1 *)(pTVar21 + (long)pTVar57);
        ppuVar7 = &((TCGContext_conflict1 *)local_e0)->pool_cur;
        pcStack_100 = (code *)0x69f161;
        args[0] = (TCGTemp *)(pTVar13 + (long)pTVar57);
        tcg_gen_callN_aarch64(pTVar57,helper_advsimd_muladdh_aarch64,(TCGTemp *)local_e8,4,args);
        s = (DisasContext_conflict1 *)local_d8;
        pcStack_100 = (code *)0x69f175;
        write_fp_sreg((DisasContext_conflict1 *)local_d8,(uint)o_11,v);
        pcStack_100 = (code *)0x69f180;
        tcg_temp_free_internal_aarch64
                  (pTVar57,(TCGTemp *)((long)&pTVar57->pool_cur + (long)ppuVar7));
        pcStack_100 = (code *)0x69f18b;
        tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar13 + (long)pTVar57));
        pcStack_100 = (code *)0x69f198;
        tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)local_d0);
        pcStack_100 = (code *)0x69f1a3;
        tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar22 + (long)pTVar57));
        pTVar59 = local_e8;
        goto LAB_0069d64e;
      }
      pc_01._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
      pc_01._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
LAB_0069db13:
      pcStack_100 = (code *)0x69db22;
      gen_exception_insn(s,pc_01,1,0x1fe0000a,uVar9);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    }
    if ((uVar10 >> 0x15 & 1) == 0) {
      uVar45 = (uint)((ulong)local_d0 >> 10) & 0x3f;
      puVar39 = auStack_f8;
      if (((uVar10 >> 0x1d & 1) != 0) || (puVar39 = auStack_f8, -1 < (int)uVar10 && uVar45 < 0x20))
      goto switchD_0069ba86_caseD_0;
      uVar46 = uVar10 >> 0x16 & 3;
      if ((((1 < uVar46) &&
           ((puVar39 = auStack_f8, uVar46 == 2 ||
            (puVar39 = auStack_f8, (*(uint *)(lVar58 + 0x58) & 0xf0000) != 0x10000)))) ||
          (uVar11 = (uVar48 & 0x1f) - 2, puVar39 = auStack_f8, 0x17 < uVar11)) ||
         (puVar39 = auStack_f8, (0xc00003U >> (uVar11 & 0x1f) & 1) == 0))
      goto switchD_0069ba86_caseD_0;
      *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
      target_el = (uint32_t)((TCGContext_conflict1 *)s)->frame_start;
      ppcVar37 = (code **)auStack_f8;
      if (target_el == 0) {
        handle_fpfpcvt(s,uVar10 & 0x1f,(uint)((ulong)local_d0 >> 5) & 0x1f,uVar48 & 7,
                       (0x3fffffU >> (uVar11 & 0x1f) & 1) != 0,3,uVar45,
                       (uint)((ulong)local_d0 >> 0x1f) & 1,uVar46);
LAB_0069f041:
        puVar27 = auStack_f8;
        goto LAB_006a0109;
      }
      goto LAB_0069fb28;
    }
    pTVar34 = local_d0;
    switch((uint)((ulong)local_d0 >> 10) & 3) {
    case 0:
      uVar55 = (ulong)local_d0 >> 0xc;
      if ((uVar55 & 0xf) == 0) {
        iVar52 = 0x20;
      }
      else {
        iVar52 = 0;
        if ((uVar55 & 0xf) != 0) {
          for (; (((uint)uVar55 & 0xf) >> iVar52 & 1) == 0; iVar52 = iVar52 + 1) {
          }
        }
      }
      puVar39 = auStack_f8;
      switch(iVar52) {
      case 0:
        pcStack_100 = (code *)0x69e843;
        disas_fp_imm(s,uVar10);
        puVar27 = auStack_f8;
        break;
      case 1:
        pcStack_100 = (code *)0x69efa1;
        disas_fp_compare(s,uVar10);
        puVar27 = auStack_f8;
        break;
      case 2:
        pcStack_100 = (code *)0x69efb1;
        disas_fp_1src(s,uVar10);
        puVar27 = auStack_f8;
        break;
      case 3:
        goto switchD_0069ba86_caseD_0;
      default:
        pcStack_100 = (code *)0x69efc1;
        disas_fp_int_conv(s,uVar10);
        puVar27 = auStack_f8;
      }
      goto LAB_006a0109;
    case 1:
      puVar39 = auStack_f8;
      if (0x1fffffff < uVar10) goto switchD_0069ba86_caseD_0;
      break;
    case 2:
      uVar45 = (uint)((ulong)local_d0 >> 0xc) & 0xf;
      pTVar57 = (TCGContext_conflict1 *)(ulong)uVar45;
      puVar39 = auStack_f8;
      if (0x1fffffff < uVar10 || 8 < uVar45) goto switchD_0069ba86_caseD_0;
      uVar9 = uVar10 & 0x1f;
      uVar55 = (ulong)uVar9;
      uVar46 = (uint)((ulong)local_d0 >> 5) & 0x1f;
      pTVar19 = (TCGContext_conflict1 *)(ulong)uVar46;
      uVar48 = uVar48 & 0x1f;
      uVar10 = uVar10 >> 0x16 & 3;
      pTVar34 = (TCGContext_conflict1 *)(ulong)uVar10;
      local_d8 = (TCGContext_conflict1 *)s;
      switch(uVar10) {
      case 0:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar10 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        if (uVar10 != 0) {
LAB_0069f96f:
          pc_00._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
          pc_00._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
          pTVar59 = (TCGContext_conflict1 *)s;
code_r0x0069f977:
          pcStack_100 = (code *)0x69f986;
          gen_exception_insn(s,pc_00,1,0x1fe0000a,uVar10);
          puVar27 = auStack_f8;
          s = (DisasContext_conflict1 *)pTVar59;
          goto LAB_006a0109;
        }
        pTVar29 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69d9b5;
        local_e8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false)
        ;
        local_d0 = (TCGContext_conflict1 *)((long)local_e8 - (long)pTVar29);
        pcStack_100 = (code *)0x69d9d1;
        local_e0 = (code *)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
        o_11 = (long)local_e0 - (long)pTVar29;
        pcStack_100 = (code *)0x69d9f5;
        tcg_gen_addi_i64_aarch64(pTVar29,(TCGv_i64)o_11,(TCGv_i64)pTVar29->cpu_env,0x2ec8);
        pcStack_100 = (code *)0x69da00;
        pTVar13 = read_fp_sreg(s,uVar46);
        pc_00 = (uint64_t)uVar48;
        pcStack_100 = (code *)0x69da0e;
        pTVar21 = read_fp_sreg(s,uVar48);
        ret = local_e8;
        pTVar59 = (TCGContext_conflict1 *)(pTVar13 + (long)pTVar29);
        pTVar53 = (TCGContext_conflict1 *)(pTVar21 + (long)pTVar29);
        a2_01 = &switchD_0069da27::switchdataD_00d8232c;
        pcVar44 = (code *)((long)&switchD_0069da27::switchdataD_00d8232c +
                          (long)(int)(&switchD_0069da27::switchdataD_00d8232c)[uVar45]);
        pTVar13 = extraout_RDX;
        switch(uVar45) {
        case 0:
          args_00 = args;
          pcVar44 = helper_vfp_muls_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 1:
          args_00 = args;
          pcVar44 = helper_vfp_divs_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 2:
          args_00 = args;
code_r0x006a14e8:
          *args_00 = (TCGTemp *)pTVar59;
          args_00[1] = (TCGTemp *)pTVar53;
          args_00[2] = (TCGTemp *)local_e0;
          pcVar44 = helper_vfp_adds_aarch64;
          break;
        case 3:
          args_00 = args;
          pcVar44 = helper_vfp_subs_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 4:
          args_00 = args;
code_r0x006a1464:
          *args_00 = (TCGTemp *)pTVar59;
          args_00[1] = (TCGTemp *)pTVar53;
          args_00[2] = (TCGTemp *)local_e0;
          pcVar44 = helper_vfp_maxs_aarch64;
          break;
        case 5:
          args_00 = args;
          pcVar44 = helper_vfp_mins_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 6:
          args_00 = args;
          pcVar44 = helper_vfp_maxnums_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 7:
          args_00 = args;
code_r0x006a154b:
          *args_00 = (TCGTemp *)pTVar59;
          args_00[1] = (TCGTemp *)pTVar53;
          args_00[2] = (TCGTemp *)local_e0;
          pcVar44 = helper_vfp_minnums_aarch64;
          break;
        case 8:
          pcStack_100 = (code *)0x6a16b6;
          args[0] = (TCGTemp *)pTVar59;
          tcg_gen_callN_aarch64(pTVar29,helper_vfp_muls_aarch64,(TCGTemp *)local_e8,3,args);
          args[0] = (TCGTemp *)ret;
          pcVar44 = helper_vfp_negs_aarch64;
          args_00 = args;
          iVar52 = 1;
          goto LAB_006a17b8;
        case 9:
          ppcVar37 = &pcStack_100;
          *(int *)pcVar44 = *(int *)pcVar44 + (int)pcVar44;
          pcVar24 = (char *)((long)&pTVar57[0x4b7].temps[0x11e].name + 1);
          *pcVar24 = *pcVar24 + ',';
          pcStack_100 = pcVar44;
          lVar58 = func_0x4469db45();
          goto code_r0x0069db34;
        case 10:
          if (pcVar44 == (code *)0x0) {
            lVar58 = 0;
            goto switchD_0069dac9_caseD_3;
          }
          bRam000000000438afc3 = bRam000000000438afc3 ^ 0x2c;
          goto code_r0x0069f977;
        case 0xb:
switchD_0069da27_caseD_b:
          pcStack_100 = (code *)0x6a00e5;
          tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)pTVar29);
          s = (DisasContext_conflict1 *)pTVar53;
LAB_006a00e5:
          pTVar54 = (TCGTemp *)((TCGContext_conflict1 *)s)->pool_first;
          iVar52 = 0xd;
          target_el = 3;
          goto LAB_0069fb39;
        case 0xc:
          halt_baddata();
        case 0xd:
          goto LAB_0069d49c;
        case 0xe:
          pcVar24 = (char *)((long)(int)(&switchD_0069da27::switchdataD_00d8232c)[uVar45] +
                            0x1b04649);
          *pcVar24 = *pcVar24 + ',';
          goto code_r0x0069d5d3;
        case 0xf:
          goto switchD_0069da27_caseD_f;
        }
LAB_006a17ab:
        iVar52 = 3;
        ret = local_e8;
LAB_006a17b8:
        pcStack_100 = (code *)0x6a17bd;
        tcg_gen_callN_aarch64(pTVar29,pcVar44,(TCGTemp *)ret,iVar52,args_00);
LAB_006a17bd:
        pTVar57 = local_d0;
        s = (DisasContext_conflict1 *)local_d8;
        pcStack_100 = (code *)0x6a17d4;
        write_fp_sreg((DisasContext_conflict1 *)local_d8,uVar9,(TCGv_i32)local_d0);
        goto LAB_006a17d4;
      case 1:
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar10 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        args_00 = (TCGTemp **)(ulong)uVar10;
        if (uVar10 != 0) goto LAB_0069f96f;
        break;
      case 2:
        goto switchD_0069bff9_caseD_1;
      case 3:
        if ((*(uint *)(lVar58 + 0x58) & 0xf0000) != 0x10000) goto switchD_0069bff9_caseD_1;
        *(undefined1 *)&((TCGContext_conflict1 *)s)->initial_buffer_size = 1;
        uVar10 = (uint)((TCGContext_conflict1 *)s)->frame_start;
        args_00 = (TCGTemp **)(ulong)uVar10;
        if (uVar10 != 0) goto LAB_0069f96f;
        pTVar29 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x6a0757;
        local_e8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false)
        ;
        local_d0 = (TCGContext_conflict1 *)((long)local_e8 - (long)pTVar29);
        pcStack_100 = (code *)0x6a0773;
        local_e0 = (code *)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
        o_11 = (long)local_e0 - (long)pTVar29;
        pcStack_100 = (code *)0x6a0797;
        tcg_gen_addi_i64_aarch64(pTVar29,(TCGv_i64)o_11,(TCGv_i64)pTVar29->cpu_env,0x2ed0);
        pcStack_100 = (code *)0x6a07a2;
        pTVar13 = read_fp_hreg(s,uVar46);
        pcStack_100 = (code *)0x6a07b0;
        pTVar21 = read_fp_hreg(s,uVar48);
        pTVar59 = (TCGContext_conflict1 *)(pTVar13 + (long)pTVar29);
        pTVar53 = (TCGContext_conflict1 *)(pTVar21 + (long)pTVar29);
        piVar23 = (int *)((long)&switchD_006a07c9::switchdataD_00d822e4 +
                         (long)(int)(&switchD_006a07c9::switchdataD_00d822e4)[uVar45]);
        switch(uVar45) {
        case 0:
          args_00 = args;
          pcVar44 = helper_advsimd_mulh_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 1:
          args_00 = args;
          pcVar44 = helper_advsimd_divh_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 2:
          args_00 = args;
          pcVar44 = helper_advsimd_addh_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 3:
          args_00 = args;
          pcVar44 = helper_advsimd_subh_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 4:
          args_00 = args;
          pcVar44 = helper_advsimd_maxh_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 5:
          args_00 = args;
          pcVar44 = helper_advsimd_minh_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 6:
          args_00 = args;
          pcVar44 = helper_advsimd_maxnumh_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 7:
          args_00 = args;
          pcVar44 = helper_advsimd_minnumh_aarch64;
          args[0] = (TCGTemp *)pTVar59;
          break;
        case 8:
          pcStack_100 = (code *)0x6a183b;
          args[0] = (TCGTemp *)pTVar59;
          tcg_gen_callN_aarch64(pTVar29,helper_advsimd_mulh_aarch64,(TCGTemp *)local_e8,3,args);
          pcStack_100 = (code *)0x6a1850;
          tcg_gen_xori_i32_aarch64(pTVar29,(TCGv_i32)local_d0,(TCGv_i32)local_d0,0x8000);
          goto LAB_006a17bd;
        case 9:
          halt_baddata();
        case 10:
          *(char *)piVar23 = (char)*piVar23 + (char)piVar23;
          *(char *)(uVar55 + 0x3608bd4) = *(char *)(uVar55 + 0x3608bd4) + -0x1c;
          goto code_r0x006a14e8;
        case 0xb:
          *piVar23 = *piVar23 + (int)piVar23;
          *(char *)(uVar55 + 0x3608bd4) = *(char *)(uVar55 + 0x3608bd4) + -0x1c;
          goto code_r0x006a1464;
        case 0xc:
          *(char *)(uVar55 + 0x3608bd4) = *(char *)(uVar55 + 0x3608bd4) + -0x1c;
          goto code_r0x006a1485;
        case 0xd:
          cVar8 = (char)piVar23 + (char)*piVar23;
          pcVar24 = (char *)CONCAT71((int7)((ulong)piVar23 >> 8),cVar8);
          *pcVar24 = *pcVar24 + cVar8;
          goto LAB_006a13f3;
        case 0xe:
          *(char *)(uVar55 + 0x3608bd4) = *(char *)(uVar55 + 0x3608bd4) + -0x1c;
          goto code_r0x006a154b;
        case 0xf:
          halt_baddata();
        }
        goto LAB_006a17ab;
      }
      pTVar29 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      pcStack_100 = (code *)0x69f8aa;
      local_e8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
      local_d0 = (TCGContext_conflict1 *)((long)local_e8 - (long)pTVar29);
      pcStack_100 = (code *)0x69f8c6;
      local_e0 = (code *)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
      o_11 = (long)local_e0 - (long)pTVar29;
      pcStack_100 = (code *)0x69f8ea;
      tcg_gen_addi_i64_aarch64(pTVar29,(TCGv_i64)o_11,(TCGv_i64)pTVar29->cpu_env,0x2ec8);
      pcStack_100 = (code *)0x69f8f5;
      pTVar14 = read_fp_dreg(s,uVar46);
      pcVar44 = (code *)(ulong)uVar48;
      pcStack_100 = (code *)0x69f903;
      pTVar15 = read_fp_dreg(s,uVar48);
      pTVar59 = (TCGContext_conflict1 *)(pTVar14 + (long)pTVar29);
      pTVar53 = (TCGContext_conflict1 *)(pTVar15 + (long)pTVar29);
      iVar52 = 0xd82308;
      piVar23 = (int *)((long)&switchD_0069f91c::switchdataD_00d82308 +
                       (long)(int)(&switchD_0069f91c::switchdataD_00d82308)[uVar45]);
      pTVar34 = extraout_RDX_00;
      switch(uVar45) {
      case 0:
        args_00 = args;
        pcVar44 = helper_vfp_muld_aarch64;
        args[0] = (TCGTemp *)pTVar59;
        break;
      case 1:
        args_00 = args;
        goto code_r0x006a1509;
      case 2:
        args_00 = args;
code_r0x006a1485:
        *args_00 = (TCGTemp *)pTVar59;
        args_00[1] = (TCGTemp *)pTVar53;
        args_00[2] = (TCGTemp *)local_e0;
        pcVar44 = helper_vfp_addd_aarch64;
        break;
      case 3:
        args_00 = args;
        pcVar44 = helper_vfp_subd_aarch64;
        args[0] = (TCGTemp *)pTVar59;
        break;
      case 4:
        args_00 = args;
        pcVar44 = helper_vfp_maxd_aarch64;
        args[0] = (TCGTemp *)pTVar59;
        break;
      case 5:
        args_00 = args;
        goto code_r0x006a156c;
      case 6:
        args_00 = args;
        pcVar44 = helper_vfp_maxnumd_aarch64;
        args[0] = (TCGTemp *)pTVar59;
        break;
      case 7:
        args_00 = args;
        goto code_r0x006a14c7;
      case 8:
        pTVar19 = (TCGContext_conflict1 *)args;
        pcVar44 = helper_vfp_muld_aarch64;
        iVar52 = 3;
        pTVar34 = local_e8;
        pTVar57 = local_e8;
        s = (DisasContext_conflict1 *)pTVar29;
        args[0] = (TCGTemp *)pTVar59;
      case 0xe:
        pcStack_100 = (code *)0x6a1624;
        tcg_gen_callN_aarch64
                  ((TCGContext_conflict1 *)s,pcVar44,(TCGTemp *)pTVar34,iVar52,(TCGTemp **)pTVar19);
        pTVar19->pool_cur = (uint8_t *)pTVar57;
        pcVar44 = helper_vfp_negd_aarch64;
        args_00 = args;
        iVar52 = 1;
        goto LAB_006a15cf;
      case 9:
        halt_baddata();
      case 10:
        args_00 = (TCGTemp **)CONCAT71((int7)((ulong)args_00 >> 8),(char)args_00 + (char)*piVar23);
        *(char *)(uVar55 + 0x3608cf0) = *(char *)(uVar55 + 0x3608cf0) + '+';
code_r0x006a156c:
        *args_00 = (TCGTemp *)pTVar59;
        args_00[1] = (TCGTemp *)pTVar53;
        args_00[2] = (TCGTemp *)local_e0;
        pcVar44 = helper_vfp_mind_aarch64;
        break;
      case 0xb:
        *piVar23 = *piVar23 + (int)piVar23;
        *(char *)(uVar55 + 0x3608c64) = *(char *)(uVar55 + 0x3608c64) + '\b';
code_r0x006a14c7:
        *args_00 = (TCGTemp *)pTVar59;
        args_00[1] = (TCGTemp *)pTVar53;
        args_00[2] = (TCGTemp *)local_e0;
        pcVar44 = helper_vfp_minnumd_aarch64;
        break;
      case 0xc:
        *(char *)(uVar55 + 0x3608c64) = *(char *)(uVar55 + 0x3608c64) + '\b';
code_r0x006a1509:
        *args_00 = (TCGTemp *)pTVar59;
        args_00[1] = (TCGTemp *)pTVar53;
        args_00[2] = (TCGTemp *)local_e0;
        pcVar44 = helper_vfp_divd_aarch64;
        break;
      case 0xd:
        in((short)extraout_RDX_00);
        halt_baddata();
      case 0xf:
        halt_baddata();
      }
      iVar52 = 3;
      pTVar57 = local_e8;
LAB_006a15cf:
      pcStack_100 = (code *)0x6a15d4;
      tcg_gen_callN_aarch64(pTVar29,pcVar44,(TCGTemp *)pTVar57,iVar52,args_00);
      pTVar57 = local_d0;
      s = (DisasContext_conflict1 *)local_d8;
      pcStack_100 = (code *)0x6a15eb;
      write_fp_dreg_aarch64((DisasContext_conflict1 *)local_d8,uVar9,(TCGv_i64)local_d0);
LAB_006a17d4:
      pcStack_100 = (code *)0x6a17e4;
      tcg_temp_free_internal_aarch64(pTVar29,(TCGTemp *)((long)&pTVar29->pool_cur + o_11));
      pcStack_100 = (code *)0x6a17ef;
      tcg_temp_free_internal_aarch64(pTVar29,(TCGTemp *)pTVar59);
      pcStack_100 = (code *)0x6a17fa;
      tcg_temp_free_internal_aarch64(pTVar29,(TCGTemp *)pTVar53);
      pcStack_100 = (code *)0x6a1808;
      tcg_temp_free_internal_aarch64
                (pTVar29,(TCGTemp *)((long)&pTVar29->pool_cur + (long)&pTVar57->pool_cur));
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    case 3:
      puVar39 = auStack_f8;
      if (0x1fffffff < uVar10) goto switchD_0069ba86_caseD_0;
      pTVar19 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      puVar39 = auStack_f8;
      switch((uint)((ulong)local_d0 >> 0x16) & 3) {
      case 0:
        uVar43 = 2;
        goto LAB_0069f9b8;
      case 1:
        uVar43 = 3;
LAB_0069f9b8:
        *(undefined1 *)&pTVar53->initial_buffer_size = 1;
        target_el = (uint32_t)pTVar53->frame_start;
        ppcVar37 = (code **)auStack_f8;
        if (target_el == 0) {
          local_d0 = (TCGContext_conflict1 *)(ulong)((uint)pTVar34 & 0x1f);
          local_c0 = (TCGContext_conflict1 *)CONCAT44(local_c0._4_4_,uVar43);
          pcStack_100 = (code *)0x69fa0b;
          o_11 = (uintptr_t)tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
          pTVar57 = (TCGContext_conflict1 *)(o_11 - (long)pTVar19);
          pcStack_100 = (code *)0x69fa2a;
          local_e0 = (code *)pTVar57;
          local_e8 = (TCGContext_conflict1 *)
                     tcg_temp_new_internal_aarch64(pTVar19,TCG_TYPE_I64,false);
          local_c8 = (TCGv_i64)((long)local_e8 - (long)pTVar19);
          memop = (MemOp)local_c0;
          pcStack_100 = (code *)0x69fa4d;
          read_vec_element((DisasContext_conflict1 *)pTVar53,(TCGv_i64)pTVar57,
                           (uint)((ulong)pTVar34 >> 5) & 0x1f,0,(MemOp)local_c0);
          pTVar14 = local_c8;
          pcStack_100 = (code *)0x69fa65;
          read_vec_element((DisasContext_conflict1 *)pTVar53,local_c8,
                           (uint)((ulong)pTVar34 >> 0x10) & 0x1f,0,memop);
          pcStack_100 = (code *)0x69fa78;
          a64_test_cc(pTVar19,(DisasCompare64 *)args,(uint)((ulong)pTVar34 >> 0xc) & 0xf);
          pcStack_100 = (code *)0x69fa82;
          pTVar15 = tcg_const_i64_aarch64(pTVar19,0);
          pTVar57 = (TCGContext_conflict1 *)local_e0;
          tcg_gen_movcond_i64_aarch64
                    (pTVar19,(TCGCond)args[0],(TCGv_i64)local_e0,(TCGv_i64)local_b0,pTVar15,
                     (TCGv_i64)local_e0,pTVar14);
          pcStack_100 = (code *)0x69fabd;
          tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)(pTVar15 + (long)pTVar19));
          pcStack_100 = (code *)0x69faca;
          tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)local_e8);
          pcStack_100 = (code *)0x69fad8;
          tcg_temp_free_internal_aarch64
                    (pTVar19,(TCGTemp *)((long)&pTVar19->pool_cur + (long)&local_b0->field_0x0));
          pcStack_100 = (code *)0x69fae8;
          write_fp_dreg_aarch64((DisasContext_conflict1 *)pTVar53,(int)local_d0,(TCGv_i64)pTVar57);
          pcStack_100 = (code *)0x69faf5;
          tcg_temp_free_internal_aarch64(pTVar19,(TCGTemp *)o_11);
          puVar27 = auStack_f8;
          s = (DisasContext_conflict1 *)pTVar53;
          goto LAB_006a0109;
        }
        goto LAB_0069fb28;
      case 3:
switchD_0069dac9_caseD_3:
        uVar43 = 1;
        puVar39 = auStack_f8;
        s = (DisasContext_conflict1 *)pTVar53;
        pTVar59 = (TCGContext_conflict1 *)o_11;
        if ((*(uint *)(lVar58 + 0x58) & 0xf0000) == 0x10000) goto LAB_0069f9b8;
      }
      goto switchD_0069ba86_caseD_0;
    }
code_r0x0069db34:
    pTVar57 = *(TCGContext_conflict1 **)(pTVar53->free_temps[1].l[1] + 0x2e8);
    uVar10 = (uint)pTVar34;
    puVar39 = (undefined1 *)ppcVar37;
    s = (DisasContext_conflict1 *)pTVar53;
    pTVar59 = (TCGContext_conflict1 *)o_11;
    switch((uint)((ulong)pTVar34 >> 0x16) & 3) {
    case 0:
      iVar52 = 2;
      goto LAB_0069fb13;
    case 1:
      iVar52 = 3;
LAB_0069fb13:
      *(undefined1 *)&pTVar53->initial_buffer_size = 1;
      target_el = (uint32_t)pTVar53->frame_start;
      if (target_el == 0) {
        *(TCGContext_conflict1 **)((long)ppcVar37 + 0x20) = pTVar53;
        uVar48 = (uint)((ulong)pTVar34 >> 0xc) & 0xf;
        if (uVar48 < 0xe) {
          *(int *)((long)ppcVar37 + 8) = iVar52;
          *(undefined8 *)((long)ppcVar37 + -8) = 0x69fc12;
          label = gen_new_label_aarch64(pTVar57);
          *(TCGLabel **)((long)ppcVar37 + 0x10) = label;
          *(undefined8 *)((long)ppcVar37 + -8) = 0x69fc22;
          pTVar17 = gen_new_label_aarch64(pTVar57);
          *(undefined8 *)((long)ppcVar37 + -8) = 0x69fc33;
          arm_gen_test_cc_aarch64(pTVar57,uVar48,label);
          *(undefined8 *)((long)ppcVar37 + -8) = 0x69fc43;
          pTVar14 = tcg_const_i64_aarch64
                              (pTVar57,(ulong)(uint)((int)*(undefined8 *)((long)ppcVar37 + 0x28) <<
                                                    0x1c));
          *(undefined8 *)((long)ppcVar37 + -8) = 0x69fc51;
          gen_set_nzcv(pTVar57,pTVar14);
          *(undefined8 *)((long)ppcVar37 + -8) = 0x69fc5f;
          tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar14 + (long)pTVar57));
          *(short *)&pTVar17->field_0x2 =
               (short)((uint)*(ushort *)&pTVar17->field_0x2 * 0x10000 + 0x10000 >> 0x10);
          *(undefined8 *)((long)ppcVar37 + -8) = 0x69fc82;
          tcg_gen_op1_aarch64(pTVar57,INDEX_op_br,(TCGArg)pTVar17);
          a1 = *(byte **)((long)ppcVar37 + 0x10);
          *a1 = *a1 | 1;
          *(undefined8 *)((long)ppcVar37 + -8) = 0x69fc97;
          tcg_gen_op1_aarch64(pTVar57,INDEX_op_set_label,(TCGArg)a1);
          iVar52 = *(int *)((long)ppcVar37 + 8);
          uVar10 = (uint)*(undefined8 *)((long)ppcVar37 + 0x28);
        }
        else {
          pTVar17 = (TCGLabel *)0x0;
        }
        s = *(DisasContext_conflict1 **)((long)ppcVar37 + 0x20);
        *(undefined8 *)((long)ppcVar37 + -8) = 0x6a0297;
        handle_fp_compare(s,iVar52,(uint)((ulong)pTVar34 >> 5) & 0x1f,
                          (uint)((ulong)pTVar34 >> 0x10) & 0x1f,false,SUB41((uVar10 & 0x10) >> 4,0))
        ;
        puVar27 = (undefined1 *)ppcVar37;
        if (uVar48 < 0xe) {
          *(byte *)pTVar17 = *(byte *)pTVar17 | 1;
          *(undefined8 *)((long)ppcVar37 + -8) = 0x6a02ba;
          tcg_gen_op1_aarch64(pTVar57,INDEX_op_set_label,(TCGArg)pTVar17);
        }
        goto LAB_006a0109;
      }
      goto LAB_0069fb28;
    case 3:
      iVar52 = 1;
      if ((*(uint *)(lVar58 + 0x58) & 0xf0000) == 0x10000) goto LAB_0069fb13;
    }
    goto switchD_0069ba86_caseD_0;
  case 8:
  case 9:
    puVar39 = auStack_f8;
    switch((uint)((ulong)local_d0 >> 0x17) & 0x3f) {
    case 0x20:
    case 0x21:
      uVar33._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
      uVar33._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
      pTVar57 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar32 = (ulong)((uint)((ulong)local_d0 >> 0x1d) & 3) |
               ((long)local_d0 << 0x28) >> 0x2b & 0xfffffffffffffffcU;
      uVar55 = uVar32 << 0xc;
      uVar47 = uVar33 & 0xfffffffffffff000;
      if (-1 < (int)uVar10) {
        uVar55 = uVar32;
        uVar47 = uVar33;
      }
      pcStack_100 = (code *)0x69bebf;
      pTVar14 = cpu_reg_aarch64(s,uVar10 & 0x1f);
      uVar55 = uVar55 + uVar47;
      pTVar14 = pTVar14 + (long)pTVar57;
      TVar42 = INDEX_op_movi_i64;
      goto LAB_0069bed1;
    case 0x22:
    case 0x23:
      pTVar29 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar48 = (uint)((ulong)local_d0 >> 10) & 0xfff;
      uVar55 = (ulong)local_d0 >> 0x16;
      pTVar14 = *(TCGv_i64 *)((long)pTVar29->cpu_X + (ulong)((uint)((ulong)local_d0 >> 2) & 0xf8));
      if ((uVar10 >> 0x1d & 1) == 0) {
        pTVar57 = (TCGContext_conflict1 *)pTVar29->cpu_X[uVar10 & 0x1f];
      }
      else {
        pcStack_100 = (code *)0x69ca4d;
        pTVar57 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar10 & 0x1f);
      }
      if ((uVar55 & 3) != 0) {
        puVar39 = auStack_f8;
        pTVar59 = (TCGContext_conflict1 *)o_11;
        if (((uint)uVar55 & 3) != 1) break;
        uVar48 = uVar48 << 0xc;
      }
      uVar55 = (ulong)uVar48;
      pcStack_100 = (code *)0x69d0f2;
      local_d8 = (TCGContext_conflict1 *)s;
      pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
      pTVar59 = local_d0;
      pTVar53 = (TCGContext_conflict1 *)((long)pTVar54 - (long)pTVar29);
      uVar10 = (uint)local_d0;
      if ((uVar10 >> 0x1d & 1) == 0) {
        if ((uVar10 >> 0x1e & 1) == 0) {
          pcStack_100 = (code *)0x69d121;
          tcg_gen_addi_i64_aarch64(pTVar29,(TCGv_i64)pTVar53,pTVar14,uVar55);
        }
        else {
          pcStack_100 = (code *)0x69d65d;
          tcg_gen_subi_i64_aarch64(pTVar29,(TCGv_i64)pTVar53,pTVar14,uVar55);
        }
      }
      else {
        pcStack_100 = (code *)0x69d139;
        o_11 = (uintptr_t)pTVar54;
        pTVar15 = tcg_const_i64_aarch64(pTVar29,uVar55);
        uVar48 = (uint)((ulong)pTVar59 >> 0x1f) & 1;
        if ((uVar10 >> 0x1e & 1) == 0) {
          pcStack_100 = (code *)0x69d15c;
          gen_add_CC(pTVar29,uVar48,(TCGv_i64)pTVar53,pTVar14,pTVar15);
        }
        else {
          pcStack_100 = (code *)0x69d664;
          gen_sub_CC(pTVar29,uVar48,(TCGv_i64)pTVar53,pTVar14,pTVar15);
        }
        pcStack_100 = (code *)0x69d672;
        tcg_temp_free_internal_aarch64(pTVar29,(TCGTemp *)(pTVar15 + (long)pTVar29));
        pTVar54 = (TCGTemp *)o_11;
      }
      if ((int)(uint)local_d0 < 0) {
        if (pTVar57 != pTVar53) {
          puVar27 = (undefined1 *)((long)&pTVar29->pool_cur + (long)&pTVar57->pool_cur);
LAB_0069e52f:
          pcStack_100 = (code *)0x69e534;
          tcg_gen_op2_aarch64(pTVar29,INDEX_op_mov_i64,(TCGArg)puVar27,(TCGArg)pTVar54);
        }
      }
      else {
LAB_0069e512:
        pcStack_100 = (code *)0x69e51a;
        tcg_gen_ext32u_i64_aarch64(pTVar29,(TCGv_i64)pTVar57,(TCGv_i64)pTVar53);
      }
LAB_0069e534:
      pTVar54 = (TCGTemp *)((long)&pTVar29->pool_cur + (long)&pTVar53->pool_cur);
      goto LAB_0069e53d;
    case 0x24:
      uVar55 = (ulong)local_d0 >> 0x16;
      puVar39 = auStack_f8;
      if ((uVar55 & 1) != 0 && -1 < (int)uVar10) break;
      o_11 = *(uintptr_t *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar45 = (uint)((ulong)local_d0 >> 0x1d) & 3;
      uVar33 = (ulong)local_d0 >> 10;
      uVar47 = (ulong)local_d0 >> 5;
      if (uVar45 == 3) {
        pcStack_100 = (code *)0x69ca40;
        local_e8 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar10 & 0x1f);
      }
      else {
        local_e8 = *(TCGContext_conflict1 **)(o_11 + 0xaeb0 + (ulong)(uVar10 & 0x1f) * 8);
      }
      pcStack_100 = (code *)0x69db7f;
      pTVar14 = cpu_reg_aarch64(s,(uint)uVar47 & 0x1f);
      pcStack_100 = (code *)0x69db93;
      _Var35 = logic_imm_decode_wmask_aarch64
                         ((uint64_t *)args,(uint)uVar55 & 1,(uint)uVar33 & 0x3f,uVar48 & 0x3f);
      pTVar59 = local_e8;
      pTVar57 = (TCGContext_conflict1 *)o_11;
      if (!_Var35) {
        pcStack_100 = (code *)0x69dbe8;
        unallocated_encoding_aarch64(s);
        puVar27 = auStack_f8;
        goto LAB_006a0109;
      }
      if (-1 < (int)(uint)local_d0) {
        args[0] = args[0] & 0xffffffff;
      }
      switch(uVar45) {
      default:
        pcStack_100 = (code *)0x69dbd9;
        tcg_gen_andi_i64_aarch64
                  ((TCGContext_conflict1 *)o_11,(TCGv_i64)local_e8,pTVar14,(int64_t)args[0]);
        bVar60 = false;
        goto LAB_0069ef20;
      case 1:
        pcStack_100 = (code *)0x69ef09;
        tcg_gen_ori_i64_aarch64
                  ((TCGContext_conflict1 *)o_11,(TCGv_i64)local_e8,pTVar14,(int64_t)args[0]);
        break;
      case 2:
        pcStack_100 = (code *)0x69ef1e;
        tcg_gen_xori_i64_aarch64
                  ((TCGContext_conflict1 *)o_11,(TCGv_i64)local_e8,pTVar14,(int64_t)args[0]);
      }
      bVar60 = true;
LAB_0069ef20:
      iVar52 = (int)local_d0;
      if (bVar60 && -1 < iVar52) {
        pcStack_100 = (code *)0x69ef3e;
        tcg_gen_ext32u_i64_aarch64(pTVar57,(TCGv_i64)pTVar59,(TCGv_i64)pTVar59);
        iVar52 = (int)local_d0;
      }
      if (uVar45 != 3) goto LAB_006a0109;
      if (iVar52 < 0) {
        pcStack_100 = (code *)0x69f1c2;
        tcg_gen_extr_i64_i32_aarch64
                  (pTVar57,*(TCGv_i32 *)((long)pTVar57 + 0xae98),
                   *(TCGv_i32 *)((long)pTVar57 + 0xae88),(TCGv_i64)pTVar59);
        TVar28 = *(long *)((long)pTVar57 + 0xae98) + (long)pTVar57;
        pcStack_100 = (code *)0x69f1e6;
        tcg_gen_op3_aarch64(pTVar57,INDEX_op_or_i32,TVar28,TVar28,
                            *(long *)((long)pTVar57 + 0xae88) + (long)pTVar57);
      }
      else {
        pcStack_100 = (code *)0x69ef67;
        tcg_gen_extrl_i64_i32_aarch64
                  (pTVar57,*(TCGv_i32 *)((long)pTVar57 + 0xae98),(TCGv_i64)pTVar59);
        if (*(long *)((long)pTVar57 + 0xae88) != *(long *)((long)pTVar57 + 0xae98)) {
          pcStack_100 = (code *)0x69ef91;
          tcg_gen_op2_aarch64(pTVar57,INDEX_op_mov_i32,
                              *(long *)((long)pTVar57 + 0xae88) + (long)pTVar57,
                              *(long *)((long)pTVar57 + 0xae98) + (long)pTVar57);
        }
      }
      pcStack_100 = (code *)0x69f1ff;
      tcg_gen_op2_aarch64(pTVar57,INDEX_op_movi_i32,
                          *(long *)((long)pTVar57 + 0xae80) + (long)pTVar57,0);
      pTVar14 = (TCGv_i64)(*(long *)((long)pTVar57 + 0xae90) + (long)pTVar57);
      TVar42 = INDEX_op_movi_i32;
      uVar55 = 0;
LAB_0069bed1:
      pcStack_100 = (code *)0x69bed6;
      tcg_gen_op2_aarch64(pTVar57,TVar42,(TCGArg)pTVar14,uVar55);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    case 0x25:
      pTVar57 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar48 = (uint)((ulong)local_d0 >> 0x15) & 3;
      pcStack_100 = (code *)0x69cb85;
      pTVar53 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar10 & 0x1f);
      iVar52 = (int)local_d0;
      puVar39 = auStack_f8;
      pTVar59 = (TCGContext_conflict1 *)o_11;
      if (uVar48 < 2 || iVar52 < 0) {
        uVar55 = (ulong)local_d0 >> 5 & 0xffff;
        uVar48 = uVar48 << 4;
        puVar39 = auStack_f8;
        switch((uint)((ulong)local_d0 >> 0x1d) & 3) {
        default:
          uVar33 = -(ulong)(((ulong)local_d0 >> 0x1d & 3) == 0) ^ uVar55 << (sbyte)uVar48;
          uVar55 = uVar33 & 0xffffffff;
          if (iVar52 < 0) {
            uVar55 = uVar33;
          }
          pTVar14 = (TCGv_i64)((long)&pTVar57->pool_cur + (long)&pTVar53->pool_cur);
          TVar42 = INDEX_op_movi_i64;
          goto LAB_0069bed1;
        case 1:
          break;
        case 3:
          pcStack_100 = (code *)0x69e63c;
          pTVar14 = tcg_const_i64_aarch64(pTVar57,uVar55);
          pcStack_100 = (code *)0x69e659;
          tcg_gen_deposit_i64_aarch64
                    (pTVar57,(TCGv_i64)pTVar53,(TCGv_i64)pTVar53,pTVar14,uVar48,0x10);
          pcStack_100 = (code *)0x69e667;
          tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar14 + (long)pTVar57));
joined_r0x0069f603:
          puVar27 = auStack_f8;
          if (-1 < iVar52) {
            pcStack_100 = (code *)0x69f61e;
            tcg_gen_ext32u_i64_aarch64(pTVar57,(TCGv_i64)pTVar53,(TCGv_i64)pTVar53);
            puVar27 = auStack_f8;
          }
          goto LAB_006a0109;
        }
      }
      break;
    case 0x26:
      uVar45 = (uint)((ulong)local_d0 >> 0x1f) & 1;
      uVar48 = uVar48 & 0x3f;
      iVar52 = uVar45 * 0x20;
      uVar46 = iVar52 + 0x20;
      local_d8 = (TCGContext_conflict1 *)s;
      if ((uVar48 <= uVar46 && uVar46 - uVar48 != 0) && uVar45 == ((uVar10 >> 0x16 & 1) != 0)) {
        uVar55 = (ulong)local_d0 >> 0x1d;
        uVar11 = (uint)uVar55 & 3;
        uVar45 = (uint)((ulong)local_d0 >> 10) & 0x3f;
        if (uVar45 < uVar46 && uVar11 != 3) {
          o_11 = *(uintptr_t *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          uVar33 = (ulong)local_d0 >> 5;
          pcStack_100 = (code *)0x69cc89;
          local_e8 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar10 & 0x1f);
          pcStack_100 = (code *)0x69cca0;
          pTVar14 = read_cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,(uint)uVar33 & 0x1f,1);
          if (uVar45 < uVar48) {
            uVar45 = uVar45 + 1;
            uVar10 = uVar46 - uVar48 & iVar52 + 0x1fU;
LAB_0069f5ae:
            if (((uVar55 & 3) == 0) && (uVar45 < uVar48)) {
              pcStack_100 = (code *)0x69f5d0;
              tcg_gen_sextract_i64_aarch64((TCGContext_conflict1 *)o_11,pTVar14,pTVar14,0,uVar45);
              uVar45 = uVar48;
            }
            if (uVar11 != 1) {
              pcStack_100 = (code *)0x69f63b;
              tcg_gen_deposit_z_i64_aarch64
                        ((TCGContext_conflict1 *)o_11,(TCGv_i64)local_e8,pTVar14,uVar10,uVar45);
              puVar27 = auStack_f8;
              s = (DisasContext_conflict1 *)local_d8;
              goto LAB_006a0109;
            }
            pcStack_100 = (code *)0x69f5f9;
            tcg_gen_deposit_i64_aarch64
                      ((TCGContext_conflict1 *)o_11,(TCGv_i64)local_e8,(TCGv_i64)local_e8,pTVar14,
                       uVar10,uVar45);
          }
          else {
            uVar45 = (uVar45 - uVar48) + 1;
            if (uVar11 == 2) {
              pcStack_100 = (code *)0x69f58e;
              tcg_gen_extract_i64_aarch64
                        ((TCGContext_conflict1 *)o_11,(TCGv_i64)local_e8,pTVar14,uVar48,uVar45);
              puVar27 = auStack_f8;
              s = (DisasContext_conflict1 *)local_d8;
              goto LAB_006a0109;
            }
            if ((uVar55 & 3) != 0) {
              pcStack_100 = (code *)0x69f5a8;
              tcg_gen_shri_i64_aarch64((TCGContext_conflict1 *)o_11,pTVar14,pTVar14,(ulong)uVar48);
              uVar10 = 0;
              goto LAB_0069f5ae;
            }
            pcStack_100 = (code *)0x69e6b0;
            tcg_gen_sextract_i64_aarch64
                      ((TCGContext_conflict1 *)o_11,(TCGv_i64)local_e8,pTVar14,uVar48,uVar45);
          }
          pTVar57 = (TCGContext_conflict1 *)o_11;
          pTVar53 = local_e8;
          s = (DisasContext_conflict1 *)local_d8;
          iVar52 = (uint)local_d0;
          goto joined_r0x0069f603;
        }
      }
      goto switchD_0069bff9_caseD_1;
    case 0x27:
      uVar55 = (ulong)local_d0 >> 10;
      uVar45 = (uint)uVar55 & 0x3f;
      puVar39 = auStack_f8;
      if (((((ulong)local_d0 & 0x60200000) == 0) &&
          (puVar39 = auStack_f8,
          ((uint)((ulong)local_d0 >> 0x1f) & 1) == ((uint)((ulong)local_d0 >> 0x16) & 1))) &&
         (puVar39 = auStack_f8, (int)uVar10 < 0 || uVar45 < 0x20)) {
        pTVar29 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        pcStack_100 = (code *)0x69cada;
        o_11 = (uintptr_t)cpu_reg_aarch64(s,uVar10 & 0x1f);
        pcStack_100 = (code *)0x69caea;
        local_e8 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar48 & 0x1f);
        if ((uVar55 & 0x3f) == 0) {
          pcStack_100 = (code *)0x6a186c;
          disas_a64_insn_cold_1();
          puVar27 = auStack_f8;
          goto LAB_006a0109;
        }
        uVar46 = (uint)((ulong)pTVar57 >> 5) & 0x1f;
        pcStack_100 = (code *)0x69cb12;
        local_d8 = (TCGContext_conflict1 *)s;
        pTVar57 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar46);
        if ((int)uVar10 < 0) {
          pcStack_100 = (code *)0x69e01b;
          tcg_gen_extract2_i64_aarch64
                    (pTVar29,(TCGv_i64)o_11,(TCGv_i64)local_e8,(TCGv_i64)pTVar57,uVar45);
          puVar27 = auStack_f8;
          s = (DisasContext_conflict1 *)local_d8;
          goto LAB_006a0109;
        }
        pcStack_100 = (code *)0x69cb2c;
        local_d0 = pTVar57;
        pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
        pTVar13 = (TCGv_i32)((long)pTVar54 - (long)pTVar29);
        pcStack_100 = (code *)0x69cb42;
        tcg_gen_extrl_i64_i32_aarch64(pTVar29,pTVar13,(TCGv_i64)local_e8);
        if ((uVar48 & 0x1f) == uVar46) {
          pcStack_100 = (code *)0x69cb5b;
          tcg_gen_rotri_i32_aarch64(pTVar29,pTVar13,pTVar13,uVar45);
        }
        else {
          pcStack_100 = (code *)0x69e17f;
          pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
          pcStack_100 = (code *)0x69e198;
          tcg_gen_extrl_i64_i32_aarch64
                    (pTVar29,(TCGv_i32)((long)pTVar54 - (long)pTVar29),(TCGv_i64)local_d0);
          pcStack_100 = (code *)0x69e1ac;
          tcg_gen_extract2_i32_aarch64
                    (pTVar29,pTVar13,pTVar13,(TCGv_i32)((long)pTVar54 - (long)pTVar29),uVar45);
          pcStack_100 = (code *)0x69e1b7;
          tcg_temp_free_internal_aarch64(pTVar29,pTVar54);
        }
        pcStack_100 = (code *)0x69e1c7;
        tcg_gen_extu_i32_i64_aarch64(pTVar29,(TCGv_i64)o_11,pTVar13);
        pTVar54 = (TCGTemp *)(pTVar13 + (long)pTVar29);
        goto LAB_0069e53d;
      }
    }
    goto switchD_0069ba86_caseD_0;
  case 10:
  case 0xb:
    if (uVar46 < 0x4a) {
      if (uVar46 < 0x1b) {
        if (uVar46 - 10 < 2) goto LAB_0069c0ca;
        puVar39 = auStack_f8;
        if (uVar46 == 0x1a) goto LAB_0069cdb1;
      }
      else {
        if (uVar46 == 0x1b) goto LAB_0069c770;
        puVar39 = auStack_f8;
        if ((uVar46 == 0x2a) && (puVar39 = auStack_f8, ((ulong)local_d0 & 0x1000010) == 0)) {
          pTVar57 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          uVar56 = (long)(int)((int)(uVar10 << 8) >> 0xb & 0xfffffffc) +
                   *(long *)&((TCGContext_conflict1 *)s)->nb_temps;
          pcStack_100 = (code *)0x69c71e;
          reset_btype(s);
          if ((uVar10 & 0xf) < 0xe) {
            pcStack_100 = (code *)0x69c730;
            pTVar17 = gen_new_label_aarch64(pTVar57);
            pcStack_100 = (code *)0x69c741;
            arm_gen_test_cc_aarch64(pTVar57,uVar10 & 0xf,pTVar17);
            pcStack_100 = (code *)0x69c74f;
            gen_goto_tb(s,0,(uint64_t)((TCGContext_conflict1 *)s)->pool_first);
            *(byte *)pTVar17 = *(byte *)pTVar17 | 1;
            pcStack_100 = (code *)0x69c763;
            tcg_gen_op1_aarch64(pTVar57,INDEX_op_set_label,(TCGArg)pTVar17);
            iVar52 = 1;
            goto LAB_0069ce46;
          }
          goto LAB_0069c114;
        }
      }
      goto switchD_0069ba86_caseD_0;
    }
    if (uVar46 < 0x5b) {
      if (uVar46 - 0x4a < 2) {
LAB_0069c0ca:
        lVar58 = *(long *)&((TCGContext_conflict1 *)s)->nb_temps;
        if ((int)uVar10 < 0) {
          pTVar57 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          pcStack_100 = (code *)0x69c0f9;
          tcg_gen_op2_aarch64(pTVar57,INDEX_op_movi_i64,
                              (TCGArg)(pTVar57->cpu_X[0x1e] + (long)pTVar57),
                              (TCGArg)((TCGContext_conflict1 *)s)->pool_first);
          uVar10 = (uint)local_d0;
        }
        uVar56 = lVar58 + ((int)(uVar10 << 6) >> 4);
        pcStack_100 = (code *)0x69c114;
        reset_btype(s);
LAB_0069c114:
        iVar52 = 0;
      }
      else {
        puVar39 = auStack_f8;
        if (uVar46 != 0x5a) goto switchD_0069ba86_caseD_0;
LAB_0069cdb1:
        pTVar57 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        uVar56 = (long)(int)((int)(uVar10 << 8) >> 0xb & 0xfffffffc) +
                 *(long *)&((TCGContext_conflict1 *)s)->nb_temps;
        pcStack_100 = (code *)0x69cde9;
        pTVar14 = read_cpu_reg_aarch64(s,uVar10 & 0x1f,(uint)((ulong)local_d0 >> 0x1f) & 1);
        pcStack_100 = (code *)0x69cdf4;
        pTVar17 = gen_new_label_aarch64(pTVar57);
        pcStack_100 = (code *)0x69cdff;
        reset_btype(s);
        pcStack_100 = (code *)0x69ce18;
        tcg_gen_brcondi_i64_aarch64
                  (pTVar57,((uVar10 >> 0x18 & 1) != 0) + TCG_COND_EQ,pTVar14,0,pTVar17);
        pcStack_100 = (code *)0x69ce26;
        gen_goto_tb(s,0,(uint64_t)((TCGContext_conflict1 *)s)->pool_first);
        *(byte *)pTVar17 = *(byte *)pTVar17 | 1;
        pcStack_100 = (code *)0x69ce3b;
        tcg_gen_op1_aarch64(pTVar57,INDEX_op_set_label,(TCGArg)pTVar17);
        iVar52 = 1;
      }
LAB_0069ce46:
      pcStack_100 = (code *)0x69ce4b;
      gen_goto_tb(s,iVar52,uVar56);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    }
    if (uVar46 == 0x5b) {
LAB_0069c770:
      pTVar57 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar55 = (ulong)local_d0 >> 0x1a;
      uVar33 = (ulong)local_d0 >> 0x13;
      o_11 = (long)(int)((int)(short)((ulong)local_d0 >> 3) & 0xfffffffc) +
             *(long *)&((TCGContext_conflict1 *)s)->nb_temps;
      pcStack_100 = (code *)0x69c7bf;
      local_e8 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I64,false);
      pTVar15 = (TCGv_i64)((long)local_e8 - (long)pTVar57);
      pcStack_100 = (code *)0x69c7d7;
      pTVar14 = cpu_reg_aarch64(s,uVar10 & 0x1f);
      pcStack_100 = (code *)0x69c7f3;
      tcg_gen_andi_i64_aarch64
                (pTVar57,pTVar15,pTVar14,1L << ((byte)uVar33 & 0x1f | (byte)uVar55 & 0x20));
      pcStack_100 = (code *)0x69c7fb;
      pTVar17 = gen_new_label_aarch64(pTVar57);
      pcStack_100 = (code *)0x69c806;
      reset_btype(s);
      pcStack_100 = (code *)0x69c823;
      tcg_gen_brcondi_i64_aarch64
                (pTVar57,(((uint)local_d0 >> 0x18 & 1) != 0) + TCG_COND_EQ,pTVar15,0,pTVar17);
      pcStack_100 = (code *)0x69c830;
      tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)local_e8);
      pcStack_100 = (code *)0x69c83e;
      gen_goto_tb(s,0,(uint64_t)((TCGContext_conflict1 *)s)->pool_first);
      *(byte *)pTVar17 = *(byte *)pTVar17 | 1;
      pcStack_100 = (code *)0x69c852;
      tcg_gen_op1_aarch64(pTVar57,INDEX_op_set_label,(TCGArg)pTVar17);
      pcStack_100 = (code *)0x69c864;
      gen_goto_tb(s,1,o_11);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    }
    if (uVar46 == 0x6a) {
      if ((uVar10 >> 0x18 & 1) == 0) {
        uVar48 = (uint)((ulong)local_d0 >> 0x15) & 7;
        puVar39 = auStack_f8;
        if (5 < (ushort)uVar48) goto switchD_0069ba86_caseD_0;
        pTVar57 = *(TCGContext_conflict1 **)
                   (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
        uVar45 = uVar10 & 0x1f;
        uVar10 = uVar10 >> 5 & 0xffff;
        puVar39 = auStack_f8;
        switch(uVar48) {
        case 0:
          if (uVar45 == 3) {
            puVar39 = auStack_f8;
            if (*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue != 0) {
              a2_00._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
              a2_00._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
              pcStack_100 = (code *)0x6a0003;
              tcg_gen_op2_aarch64(pTVar57,INDEX_op_movi_i64,
                                  (TCGArg)(pTVar57->cpu_pc_arm64 + (long)pTVar57),a2_00);
              uVar9 = uVar10 | 0x5e000000;
              pcStack_100 = (code *)0x6a0013;
              pTVar13 = tcg_const_i32_aarch64(pTVar57,uVar9);
              args[0] = (TCGTemp *)(pTVar57->cpu_env + (long)pTVar57);
              pcStack_100 = (code *)0x6a0043;
              tcg_gen_callN_aarch64(pTVar57,helper_pre_smc_aarch64,(TCGTemp *)0x0,2,args);
              pcStack_100 = (code *)0x6a004e;
              tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar13 + (long)pTVar57));
              if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 1) == '\x01')
              {
                pTVar57 = *(TCGContext_conflict1 **)
                           (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
                *(undefined1 *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 2) = 0;
                pcStack_100 = (code *)0x6a007e;
                pTVar29 = (TCGContext_conflict1 *)
                          tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I32,false);
                pcStack_100 = (code *)0x6a00a7;
                tcg_gen_op3_aarch64(pTVar57,INDEX_op_ld_i32,(TCGArg)pTVar29,
                                    (TCGArg)(pTVar57->cpu_env + (long)pTVar57),0x148);
                pcStack_100 = (code *)0x6a00ba;
                tcg_gen_andi_i32_aarch64
                          (pTVar57,(TCGv_i32)((long)pTVar29 - (long)pTVar57),
                           (TCGv_i32)((long)pTVar29 - (long)pTVar57),-0x200001);
                pcStack_100 = (code *)0x6a00da;
                tcg_gen_op3_aarch64(pTVar57,INDEX_op_st_i32,(TCGArg)pTVar29,
                                    (TCGArg)(pTVar57->cpu_env + (long)pTVar57),0x148);
                goto switchD_0069da27_caseD_b;
              }
              goto LAB_006a00e5;
            }
            break;
          }
          if (uVar45 == 2) {
            puVar39 = auStack_f8;
            if (*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue != 0) {
              a2._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
              a2._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
              pcStack_100 = (code *)0x69fefc;
              tcg_gen_op2_aarch64(pTVar57,INDEX_op_movi_i64,
                                  (TCGArg)(pTVar57->cpu_pc_arm64 + (long)pTVar57),a2);
              args[0] = (TCGTemp *)(pTVar57->cpu_env + (long)pTVar57);
              pcStack_100 = (code *)0x69ff24;
              tcg_gen_callN_aarch64(pTVar57,helper_pre_hvc_aarch64,(TCGTemp *)0x0,1,args);
              if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 1) == '\x01')
              {
                pTVar57 = *(TCGContext_conflict1 **)
                           (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
                *(undefined1 *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 2) = 0;
                pcStack_100 = (code *)0x69ff54;
                pTVar54 = tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I32,false);
                pcStack_100 = (code *)0x69ff7d;
                tcg_gen_op3_aarch64(pTVar57,INDEX_op_ld_i32,(TCGArg)pTVar54,
                                    (TCGArg)(pTVar57->cpu_env + (long)pTVar57),0x148);
                pcStack_100 = (code *)0x69ff90;
                tcg_gen_andi_i32_aarch64
                          (pTVar57,(TCGv_i32)((long)pTVar54 - (long)pTVar57),
                           (TCGv_i32)((long)pTVar54 - (long)pTVar57),-0x200001);
                pcStack_100 = (code *)0x69ffb0;
                tcg_gen_op3_aarch64(pTVar57,INDEX_op_st_i32,(TCGArg)pTVar54,
                                    (TCGArg)(pTVar57->cpu_env + (long)pTVar57),0x148);
                pcStack_100 = (code *)0x69ffbb;
                tcg_temp_free_internal_aarch64(pTVar57,pTVar54);
              }
              pTVar54 = (TCGTemp *)((TCGContext_conflict1 *)s)->pool_first;
              uVar9 = uVar10 | 0x5a000000;
              iVar52 = 0xb;
              target_el = 2;
              puVar38 = auStack_f8;
              goto LAB_0069fb39;
            }
            break;
          }
          puVar39 = auStack_f8;
          if (uVar45 != 1) break;
          if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 1) == '\x01') {
            *(undefined1 *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 2) = 0;
            pcStack_100 = (code *)0x69d036;
            pTVar54 = tcg_temp_new_internal_aarch64(pTVar57,TCG_TYPE_I32,false);
            pcStack_100 = (code *)0x69d05f;
            tcg_gen_op3_aarch64(pTVar57,INDEX_op_ld_i32,(TCGArg)pTVar54,
                                (TCGArg)(pTVar57->cpu_env + (long)pTVar57),0x148);
            pcStack_100 = (code *)0x69d072;
            tcg_gen_andi_i32_aarch64
                      (pTVar57,(TCGv_i32)((long)pTVar54 - (long)pTVar57),
                       (TCGv_i32)((long)pTVar54 - (long)pTVar57),-0x200001);
            pcStack_100 = (code *)0x69d092;
            tcg_gen_op3_aarch64(pTVar57,INDEX_op_st_i32,(TCGArg)pTVar54,
                                (TCGArg)(pTVar57->cpu_env + (long)pTVar57),0x148);
            pcStack_100 = (code *)0x69d09d;
            tcg_temp_free_internal_aarch64(pTVar57,pTVar54);
          }
          pTVar54 = (TCGTemp *)((TCGContext_conflict1 *)s)->pool_first;
          uVar9 = uVar10 | 0x56000000;
          if (((int)((TCGContext_conflict1 *)s)->current_frame_offset != 0x17) ||
             (target_el = 3, *(char *)((long)&((TCGContext_conflict1 *)s)->frame_end + 4) == '\0'))
          {
            target_el = 1;
            if (1 < (int)*(uint32_t *)&((TCGContext_conflict1 *)s)->code_gen_epilogue) {
              target_el = *(uint32_t *)&((TCGContext_conflict1 *)s)->code_gen_epilogue;
            }
          }
          iVar52 = 2;
          puVar38 = auStack_f8;
          goto LAB_0069fb39;
        case 1:
          puVar39 = auStack_f8;
          if (((ulong)local_d0 & 0x1f) == 0) {
            TVar28._0_4_ = ((TCGContext_conflict1 *)s)->nb_temps;
            TVar28._4_4_ = ((TCGContext_conflict1 *)s)->nb_indirects;
            pcStack_100 = (code *)0x69ec14;
            tcg_gen_op2_aarch64(pTVar57,INDEX_op_movi_i64,
                                (TCGArg)(pTVar57->cpu_pc_arm64 + (long)pTVar57),TVar28);
            pcStack_100 = (code *)0x69ec1e;
            pTVar13 = tcg_const_i32_aarch64(pTVar57,uVar10 | 0xf2000000);
            args[0] = (TCGTemp *)(pTVar57->cpu_env + (long)pTVar57);
            pcStack_100 = (code *)0x69ec4e;
            tcg_gen_callN_aarch64(pTVar57,helper_exception_bkpt_insn_aarch64,(TCGTemp *)0x0,2,args);
            pcStack_100 = (code *)0x69ec59;
            tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar13 + (long)pTVar57));
            *(undefined4 *)&((TCGContext_conflict1 *)s)->pool_current = 2;
            puVar27 = auStack_f8;
            goto LAB_006a0109;
          }
        }
        goto switchD_0069ba86_caseD_0;
      }
      if (((ulong)local_d0 & 0xc00000) == 0) {
        pcStack_100 = (code *)0x69d327;
        disas_system(s,uVar10);
        puVar27 = auStack_f8;
        goto LAB_006a0109;
      }
      goto LAB_006a0101;
    }
    puVar39 = auStack_f8;
    if (uVar46 != 0x6b) goto switchD_0069ba86_caseD_0;
    if ((~uVar10 & 0x1f0000) != 0) goto switchD_0069c1f7_caseD_3;
    uVar48 = (uint)((ulong)local_d0 >> 0x15);
    uVar45 = uVar48 & 0xf;
    if (9 < uVar45) goto switchD_0069c1f7_caseD_3;
    pTVar59 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    uVar55 = (ulong)local_d0 >> 10;
    uVar51 = (uint)uVar55 & 0x3f;
    uVar46 = (uint)((ulong)local_d0 >> 5);
    uVar11 = uVar46 & 0x7ffffff;
    uVar46 = uVar46 & 0x1f;
    uVar50 = uVar10 & 0x1f;
    switch(uVar45) {
    default:
      if (uVar51 - 2 < 2) {
        if ((*(uint *)(lVar58 + 0x50) & 0xff000ff0) == 0) break;
        if (uVar45 == 2) {
          if ((uVar50 & uVar11) != 0x1f) break;
          pTVar14 = pTVar59->cpu_X[0x1f];
          uVar46 = 0x1e;
          local_d0 = pTVar59;
        }
        else {
          if (uVar50 != 0x1f) break;
          pcStack_100 = (code *)0x69fe51;
          local_d0 = pTVar59;
          pTVar14 = new_tmp_a64_zero_aarch64(s);
        }
        if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
          pcStack_100 = (code *)0x69fe6c;
          o_11 = (uintptr_t)pTVar14;
          local_e0 = (code *)new_tmp_a64_aarch64(s);
          pTVar59 = local_d0;
          local_e8 = (TCGContext_conflict1 *)(local_d0->cpu_env + (long)local_d0);
          pcStack_100 = (code *)0x69fe8f;
          cpu_reg_aarch64(s,uVar46);
          pTVar57 = (TCGContext_conflict1 *)local_e0;
          if (uVar51 == 2) {
            pcVar44 = helper_autia_aarch64;
          }
          else {
            pcVar44 = helper_autib_aarch64;
          }
          args[0] = (TCGTemp *)local_e8;
          pcStack_100 = (code *)0x6a0b89;
          tcg_gen_callN_aarch64
                    (pTVar59,pcVar44,
                     (TCGTemp *)
                     ((long)&pTVar59->pool_cur + (long)&((TCGContext_conflict1 *)local_e0)->pool_cur
                     ),3,args);
        }
        else {
          pcStack_100 = (code *)0x6a05f0;
          pTVar57 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar46);
        }
      }
      else {
        if (((uVar55 & 0x3f) != 0) || (((ulong)local_d0 & 0x1f) != 0)) break;
        pcStack_100 = (code *)0x69eca3;
        local_d0 = pTVar59;
        pTVar57 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar46);
      }
      pcStack_100 = (code *)0x6a0b94;
      gen_a64_set_pc(s,(TCGv_i64)pTVar57);
      uVar48 = 1;
      if (uVar45 == 1) {
LAB_006a0561:
        uVar45 = uVar48;
        pcStack_100 = (code *)0x6a058c;
        tcg_gen_op2_aarch64(local_d0,INDEX_op_movi_i64,
                            (long)&local_d0->pool_cur +
                            *(long *)(*(long *)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] +
                                               0x2e8) + 0xafa0),
                            (TCGArg)((TCGContext_conflict1 *)s)->pool_first);
      }
      goto LAB_006a058f;
    case 3:
    case 6:
    case 7:
      break;
    case 4:
      if (*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue != 0) {
        pTVar19 = (TCGContext_conflict1 *)s;
        if (uVar51 - 2 < 2) {
          if (((uVar50 & uVar11) != 0x1f) || ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) == 0)) break;
          pcStack_100 = (code *)0x69f25c;
          pTVar54 = tcg_temp_new_internal_aarch64(pTVar59,TCG_TYPE_I64,false);
          pTVar29 = (TCGContext_conflict1 *)((long)pTVar54 - (long)pTVar59);
          pcStack_100 = (code *)0x69f28e;
          tcg_gen_op3_aarch64(pTVar59,INDEX_op_ld_i64,(TCGArg)pTVar54,
                              (TCGArg)(pTVar59->cpu_env + (long)pTVar59),
                              (long)*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue * 8 +
                              0x238);
          if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
            args[0] = (TCGTemp *)(pTVar59->cpu_env + (long)pTVar59);
            if (uVar51 == 2) {
              pcVar44 = helper_autia_aarch64;
            }
            else {
              pcVar44 = helper_autib_aarch64;
            }
            pcStack_100 = (code *)0x6a13f3;
            tcg_gen_callN_aarch64(pTVar59,pcVar44,(TCGTemp *)((long)pTVar59 + (long)pTVar29),3,args)
            ;
          }
        }
        else {
          if (((uVar55 & 0x3f) != 0) || (((ulong)local_d0 & 0x1f) != 0)) break;
          pcStack_100 = (code *)0x6a0495;
          pTVar54 = tcg_temp_new_internal_aarch64(pTVar59,TCG_TYPE_I64,false);
          pTVar29 = (TCGContext_conflict1 *)((long)pTVar54 - (long)pTVar59);
          pcStack_100 = (code *)0x6a04c7;
          tcg_gen_op3_aarch64(pTVar59,INDEX_op_ld_i64,(TCGArg)pTVar54,
                              (TCGArg)(pTVar59->cpu_env + (long)pTVar59),
                              (long)*(int *)&((TCGContext_conflict1 *)s)->code_gen_epilogue * 8 +
                              0x238);
        }
LAB_006a13f3:
        args[0] = (TCGTemp *)(pTVar59->cpu_env + (long)pTVar59);
        pcStack_100 = (code *)0x6a1423;
        tcg_gen_callN_aarch64(pTVar59,helper_exception_return_aarch64,(TCGTemp *)0x0,2,args);
        pcStack_100 = (code *)0x6a142e;
        tcg_temp_free_internal_aarch64
                  (pTVar59,(TCGTemp *)((long)&pTVar59->pool_cur + (long)&pTVar29->pool_cur));
        *(undefined4 *)&pTVar19->pool_current = 0xc;
        puVar27 = auStack_f8;
        s = (DisasContext_conflict1 *)pTVar19;
        goto LAB_006a0109;
      }
      break;
    case 5:
      break;
    case 8:
    case 9:
      if (((uVar10 & 0xf800) != 0x800) || ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) == 0)) break;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
        pcStack_100 = (code *)0x69ea15;
        local_d8 = (TCGContext_conflict1 *)s;
        local_d0 = pTVar59;
        local_e0 = (code *)new_tmp_a64_aarch64(s);
        pTVar59 = local_d0;
        local_e8 = (TCGContext_conflict1 *)(local_d0->cpu_env + (long)local_d0);
        o_11 = (long)&local_d0->pool_cur +
               *(long *)(*(long *)(local_d8->free_temps[1].l[1] + 0x2e8) + 0xaeb0 +
                        (ulong)uVar50 * 8);
        pcStack_100 = (code *)0x69ea5a;
        cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar46);
        pTVar57 = (TCGContext_conflict1 *)local_e0;
        if (uVar51 == 2) {
          pcVar44 = helper_autia_aarch64;
        }
        else {
          pcVar44 = helper_autib_aarch64;
        }
        args[0] = (TCGTemp *)local_e8;
        pcStack_100 = (code *)0x6a0549;
        tcg_gen_callN_aarch64
                  (pTVar59,pcVar44,
                   (TCGTemp *)
                   ((long)&pTVar59->pool_cur + (long)&((TCGContext_conflict1 *)local_e0)->pool_cur),
                   3,args);
      }
      else {
        pcStack_100 = (code *)0x69fe30;
        local_d0 = pTVar59;
        pTVar57 = (TCGContext_conflict1 *)cpu_reg_aarch64(s,uVar46);
      }
      uVar48 = uVar48 & 1;
      pcStack_100 = (code *)0x6a0558;
      gen_a64_set_pc(s,(TCGv_i64)pTVar57);
      bVar60 = uVar45 == 9;
      uVar45 = uVar48;
      if (bVar60) goto LAB_006a0561;
LAB_006a058f:
      if (uVar45 == 1) {
        iVar52 = 2;
        if ((*(byte *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x60) & 0xf) != 0)
        goto LAB_006a05d1;
      }
      else if ((uVar45 == 0) &&
              ((*(byte *)(*(long *)&((TCGContext_conflict1 *)s)->nb_labels + 0x60) & 0xf) != 0)) {
        iVar52 = 1;
        if ((uVar46 & 0xfffffffe) != 0x10) {
          iVar52 = (uint)*(byte *)((long)&((TCGContext_conflict1 *)s)->code_gen_buffer_size + 1) * 2
                   + 1;
        }
LAB_006a05d1:
        pcStack_100 = (code *)0x6a05d9;
        set_btype(s,iVar52);
      }
      *(undefined4 *)&((TCGContext_conflict1 *)s)->pool_current = 3;
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    }
switchD_0069c1f7_caseD_3:
    pcStack_100 = (code *)0x69f2ed;
    unallocated_encoding_aarch64(s);
    puVar27 = auStack_f8;
    goto LAB_006a0109;
  }
  uVar55 = (ulong)local_d0 >> 0x1e;
  switch(uVar46) {
  case 0:
    if (uVar50 < 0x33) {
      if ((0x4000400040004U >> uVar50 & 1) != 0) {
        puVar39 = auStack_f8;
        if (((uVar10 & 0xe01f801f) == 0x2000000d) &&
           (puVar39 = auStack_f8, (*(byte *)(lVar58 + 0x4e) & 0xf0) != 0)) {
          pTVar29 = *(TCGContext_conflict1 **)
                     (((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
          uVar55 = (ulong)local_d0 >> 5;
          bVar60 = (uVar10 >> 0xe & 1) == 0;
          pcStack_100 = (code *)0x69d556;
          pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
          pTVar57 = (TCGContext_conflict1 *)((long)pTVar54 - (long)pTVar29);
          pcStack_100 = (code *)0x69d566;
          pTVar14 = cpu_reg_aarch64(s,(uint)uVar55 & 0x1f);
          pcStack_100 = (code *)0x69d574;
          tcg_gen_extrl_i64_i32_aarch64(pTVar29,(TCGv_i32)pTVar57,pTVar14);
          pcStack_100 = (code *)0x69d589;
          tcg_gen_shli_i32_aarch64
                    (pTVar29,pTVar29->cpu_NF,(TCGv_i32)pTVar57,(uint)bVar60 * 8 + 0x10);
          pcStack_100 = (code *)0x69d5a3;
          tcg_gen_shli_i32_aarch64(pTVar29,pTVar29->cpu_VF,(TCGv_i32)pTVar57,(uint)bVar60 * 8 + 0xf)
          ;
          if (pTVar29->cpu_ZF != pTVar29->cpu_NF) {
            pTVar13 = pTVar29->cpu_ZF + (long)pTVar29;
            a2_01 = (uint *)(pTVar29->cpu_NF + (long)pTVar29);
            pc_00 = 5;
            s = (DisasContext_conflict1 *)pTVar29;
switchD_0069da27_caseD_f:
            pcStack_100 = (code *)0x69d5c9;
            tcg_gen_op2_aarch64((TCGContext_conflict1 *)s,(TCGOpcode)pc_00,(TCGArg)pTVar13,
                                (TCGArg)a2_01);
          }
          a2_01 = (uint *)(pTVar29->cpu_VF + (long)pTVar29);
code_r0x0069d5d3:
          pcStack_100 = (code *)0x69d5ed;
          tcg_gen_op3_aarch64(pTVar29,INDEX_op_xor_i32,(TCGArg)a2_01,(TCGArg)a2_01,
                              (TCGArg)(pTVar29->cpu_NF + (long)pTVar29));
          pTVar54 = (TCGTemp *)((long)&pTVar29->pool_cur + (long)&pTVar57->pool_cur);
          goto LAB_0069e53d;
        }
        goto switchD_0069ba86_caseD_0;
      }
      if ((0x200000002U >> uVar50 & 1) != 0) {
        pcStack_100 = (code *)0x69e1f9;
        disas_rotate_right_into_flags(s,uVar10);
        puVar27 = auStack_f8;
        goto LAB_006a0109;
      }
      if ((uVar33 & 0x3f) == 0) {
        pcStack_100 = (code *)0x69ee4e;
        disas_adc_sbc(s,uVar10);
        puVar27 = auStack_f8;
        goto LAB_006a0109;
      }
    }
  case 1:
  case 3:
  case 5:
  case 7:
    goto switchD_0069bff9_caseD_1;
  case 2:
    if ((uVar10 >> 0x1d & 1) != 0) {
      if (((ulong)local_d0 & 0x410) != 0) {
        pcStack_100 = (code *)0x69e03a;
        unallocated_encoding_aarch64(s);
        puVar27 = auStack_f8;
        goto LAB_006a0109;
      }
      pTVar29 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
      uVar55 = (ulong)local_d0 >> 0xc;
      uVar33 = (ulong)local_d0 >> 5;
      pcStack_100 = (code *)0x69ee8b;
      local_e0 = (code *)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
      pTVar57 = (TCGContext_conflict1 *)((long)local_e0 - (long)pTVar29);
      pcStack_100 = (code *)0x69eea9;
      arm_test_cc_aarch64(pTVar29,(DisasCompare *)args,(uint)uVar55 & 0xf);
      pcStack_100 = (code *)0x69eec8;
      local_e8 = pTVar57;
      tcg_gen_setcondi_i32_aarch64
                (pTVar29,(TCGCond)args[0] ^ TCG_COND_ALWAYS,(TCGv_i32)pTVar57,(TCGv_i32)local_b0,0);
      pcStack_100 = (code *)0x69eed3;
      arm_free_cc_aarch64(pTVar29,(DisasCompare *)args);
      pTVar57 = local_d8;
      if (((uint)local_d0 >> 0xb & 1) == 0) {
        pcStack_100 = (code *)0x69eeee;
        pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar48 & 0x1f);
      }
      else {
        pcStack_100 = (code *)0x69fd07;
        pTVar14 = new_tmp_a64_aarch64((DisasContext_conflict1 *)local_d8);
        pcStack_100 = (code *)0x69fd1d;
        tcg_gen_op2_aarch64(pTVar29,INDEX_op_movi_i64,(TCGArg)(pTVar14 + (long)pTVar29),
                            (ulong)(uVar48 & 0x1f));
      }
      uVar48 = (uint)local_d0;
      uVar10 = (uint)((ulong)local_d0 >> 0x1f) & 1;
      pcStack_100 = (code *)0x69fd32;
      pTVar15 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar57,(uint)uVar33 & 0x1f);
      pcStack_100 = (code *)0x69fd44;
      pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
      pTVar36 = (TCGv_i64)((long)pTVar54 - (long)pTVar29);
      if ((uVar48 >> 0x1e & 1) == 0) {
        pcStack_100 = (code *)0x69fd64;
        gen_add_CC(pTVar29,uVar10,pTVar36,pTVar15,pTVar14);
      }
      else {
        pcStack_100 = (code *)0x69fd6b;
        gen_sub_CC(pTVar29,uVar10,pTVar36,pTVar15,pTVar14);
      }
      pcStack_100 = (code *)0x69fd79;
      tcg_temp_free_internal_aarch64(pTVar29,(TCGTemp *)(pTVar36 + (long)pTVar29));
      pcStack_100 = (code *)0x69fd85;
      pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
      pTVar13 = (TCGv_i32)((long)pTVar54 - (long)pTVar29);
      pcStack_100 = (code *)0x69fd9a;
      o_11 = (uintptr_t)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
      pTVar59 = (TCGContext_conflict1 *)local_e0;
      pTVar53 = (TCGContext_conflict1 *)(o_11 - (long)pTVar29);
      pcStack_100 = (code *)0x69fdbd;
      tcg_gen_op2_aarch64(pTVar29,INDEX_op_neg_i32,(TCGArg)pTVar54,(TCGArg)local_e0);
      pTVar57 = local_e8;
      pcStack_100 = (code *)0x69fdd5;
      tcg_gen_subi_i32_aarch64(pTVar29,(TCGv_i32)pTVar53,(TCGv_i32)local_e8,1);
      if (((ulong)local_d0 & 8) == 0) {
        pTVar21 = pTVar29->cpu_NF;
        if (have_bmi1_aarch64 != true) {
          TVar42 = INDEX_op_and_i32;
          pTVar20 = (TCGTemp *)o_11;
          goto LAB_006a0340;
        }
        pcStack_100 = (code *)0x69fe01;
        tcg_gen_andc_i32_aarch64(pTVar29,pTVar21,pTVar21,pTVar13);
      }
      else {
        pTVar21 = pTVar29->cpu_NF;
        TVar42 = INDEX_op_or_i32;
        pTVar20 = pTVar54;
LAB_006a0340:
        pcStack_100 = (code *)0x6a0345;
        tcg_gen_op3_aarch64(pTVar29,TVar42,(TCGArg)(pTVar21 + (long)pTVar29),
                            (TCGArg)(pTVar21 + (long)pTVar29),(TCGArg)pTVar20);
      }
      if (((ulong)local_d0 & 4) == 0) {
        pTVar21 = pTVar29->cpu_ZF;
        TVar42 = INDEX_op_or_i32;
        pTVar19 = pTVar59;
LAB_006a039c:
        pcStack_100 = (code *)0x6a03a1;
        tcg_gen_op3_aarch64(pTVar29,TVar42,(TCGArg)(pTVar21 + (long)pTVar29),
                            (TCGArg)(pTVar21 + (long)pTVar29),(TCGArg)pTVar19);
      }
      else {
        pTVar21 = pTVar29->cpu_ZF;
        if (have_bmi1_aarch64 != true) {
          TVar42 = INDEX_op_and_i32;
          pTVar19 = (TCGContext_conflict1 *)o_11;
          goto LAB_006a039c;
        }
        pcStack_100 = (code *)0x6a0387;
        tcg_gen_andc_i32_aarch64(pTVar29,pTVar21,pTVar21,pTVar13);
      }
      if (((ulong)local_d0 & 2) == 0) {
        pTVar21 = pTVar29->cpu_CF;
        if (have_bmi1_aarch64 != true) {
          TVar42 = INDEX_op_and_i32;
          pTVar59 = (TCGContext_conflict1 *)o_11;
          goto LAB_006a03f8;
        }
        pcStack_100 = (code *)0x6a03c9;
        tcg_gen_andc_i32_aarch64(pTVar29,pTVar21,pTVar21,pTVar13);
      }
      else {
        pTVar21 = pTVar29->cpu_CF;
        TVar42 = INDEX_op_or_i32;
LAB_006a03f8:
        pcStack_100 = (code *)0x6a03fd;
        tcg_gen_op3_aarch64(pTVar29,TVar42,(TCGArg)(pTVar21 + (long)pTVar29),
                            (TCGArg)(pTVar21 + (long)pTVar29),(TCGArg)pTVar59);
      }
      if (((ulong)local_d0 & 1) == 0) {
        pTVar21 = pTVar29->cpu_VF;
        if (have_bmi1_aarch64 != true) {
          TVar42 = INDEX_op_and_i32;
          pTVar54 = (TCGTemp *)o_11;
          goto LAB_006a0454;
        }
        pcStack_100 = (code *)0x6a0425;
        tcg_gen_andc_i32_aarch64(pTVar29,pTVar21,pTVar21,pTVar13);
      }
      else {
        pTVar21 = pTVar29->cpu_VF;
        TVar42 = INDEX_op_or_i32;
LAB_006a0454:
        pcStack_100 = (code *)0x6a0459;
        tcg_gen_op3_aarch64(pTVar29,TVar42,(TCGArg)(pTVar21 + (long)pTVar29),
                            (TCGArg)(pTVar21 + (long)pTVar29),(TCGArg)pTVar54);
      }
      pcStack_100 = (code *)0x6a0467;
      tcg_temp_free_internal_aarch64
                (pTVar29,(TCGTemp *)((long)&pTVar29->pool_cur + (long)&pTVar57->pool_cur));
      pTVar54 = (TCGTemp *)(pTVar13 + (long)pTVar29);
      goto LAB_0069d7f8;
    }
    goto switchD_0069bff9_caseD_1;
  case 4:
    if (((ulong)local_d0 & 0x20000800) != 0) {
      pcStack_100 = (code *)0x69d4d5;
      unallocated_encoding_aarch64(s);
      puVar27 = auStack_f8;
      s = (DisasContext_conflict1 *)local_d8;
      goto LAB_006a0109;
    }
    pTVar57 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    uVar33 = (ulong)local_d0 >> 0xc;
    o_11 = CONCAT44(o_11._4_4_,uVar11) & 0xffffffff00000001;
    local_c0 = (TCGContext_conflict1 *)
               (CONCAT44(local_c0._4_4_,(int)((ulong)local_d0 >> 5)) & 0xffffffff07ffffff);
    pcStack_100 = (code *)0x69e58e;
    local_e0 = (code *)cpu_reg_aarch64(s,uVar10 & 0x1f);
    pcStack_100 = (code *)0x69e5a3;
    a64_test_cc(pTVar57,(DisasCompare64 *)args,(uint)uVar33 & 0xf);
    pcStack_100 = (code *)0x69e5b2;
    local_e8 = pTVar57;
    pTVar14 = tcg_const_i64_aarch64(pTVar57,0);
    pTVar53 = local_d8;
    pTVar59 = (TCGContext_conflict1 *)local_e0;
    pTVar57 = local_e8;
    local_c8 = (TCGv_i64)(CONCAT44(local_c8._4_4_,uVar48) & 0xffffffff0000001f);
    if ((uint)o_11 == ((uint)uVar55 & 1) || (uVar48 & 0x1f & (MemOp)local_c0) != 0x1f) {
      pcStack_100 = (code *)0x69e5e8;
      pTVar15 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,(MemOp)local_c0 & 0x1f);
      pcStack_100 = (code *)0x69e5fc;
      pTVar36 = read_cpu_reg_aarch64((DisasContext_conflict1 *)pTVar53,(int)local_c8,1);
      pTVar59 = (TCGContext_conflict1 *)local_e0;
      pTVar57 = local_e8;
      if (((uint)uVar55 & 3 & uVar11 & 0x3fffff) == 1) {
        pcStack_100 = (code *)0x69e627;
        tcg_gen_op2_aarch64(local_e8,INDEX_op_neg_i64,(TCGArg)(pTVar36 + (long)local_e8),
                            (TCGArg)(pTVar36 + (long)local_e8));
        pTVar59 = (TCGContext_conflict1 *)local_e0;
      }
      else if ((uVar55 & 1) == 0) {
        if ((uint)o_11 != 0) {
          pcStack_100 = (code *)0x69fcf5;
          tcg_gen_addi_i64_aarch64(local_e8,pTVar36,pTVar36,1);
        }
      }
      else {
        pcStack_100 = (code *)0x6a02cd;
        tcg_gen_not_i64_aarch64(local_e8,pTVar36,pTVar36);
      }
      tcg_gen_movcond_i64_aarch64
                (pTVar57,(TCGCond)args[0],(TCGv_i64)pTVar59,(TCGv_i64)local_b0,pTVar14,pTVar15,
                 pTVar36);
    }
    else {
      pcStack_100 = (code *)0x69ee0e;
      tcg_gen_setcond_i64_aarch64
                (local_e8,(TCGCond)args[0] ^ TCG_COND_ALWAYS,(TCGv_i64)local_e0,(TCGv_i64)local_b0,
                 pTVar14);
      if ((uVar55 & 1) != 0) {
        TVar28 = (long)&pTVar57->pool_cur + (long)&pTVar59->pool_cur;
        pcStack_100 = (code *)0x69ee30;
        tcg_gen_op2_aarch64(pTVar57,INDEX_op_neg_i64,TVar28,TVar28);
      }
    }
    pcStack_100 = (code *)0x6a02ff;
    tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)(pTVar14 + (long)pTVar57));
    pcStack_100 = (code *)0x6a030f;
    tcg_temp_free_internal_aarch64
              (pTVar57,(TCGTemp *)((long)&pTVar57->pool_cur + (long)&local_b0->field_0x0));
    puVar27 = auStack_f8;
    pTVar53 = pTVar59;
    s = (DisasContext_conflict1 *)local_d8;
    if ((int)(uint)local_d0 < 0) goto LAB_006a0109;
LAB_006a0323:
    pcStack_100 = (code *)0x6a0328;
    tcg_gen_ext32u_i64_aarch64(pTVar57,(TCGv_i64)pTVar53,(TCGv_i64)pTVar59);
    puVar27 = auStack_f8;
    s = (DisasContext_conflict1 *)local_d8;
    goto LAB_006a0109;
  case 6:
    if ((uVar55 & 1) == 0) {
      pcStack_100 = (code *)0x69d631;
      disas_data_proc_2src(s,uVar10);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    }
    if ((uVar10 >> 0x1d & 1) != 0) goto LAB_0069d60b;
    break;
  default:
    pTVar29 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    uVar50 = (uint)((ulong)local_d0 >> 0x14) & 0xe | uVar45 & 0x70;
    uVar46 = (uint)((ulong)local_d0 >> 0xf) & 1;
    uVar43 = 0;
    uVar45 = (uVar46 + uVar50) - 0x40;
    if (uVar45 < 0xd) {
      if ((0x1c03U >> (uVar45 & 0x1f) & 1) == 0) {
        if ((0x1cU >> (uVar45 & 0x1f) & 1) == 0) goto LAB_0069ce50;
        uVar43 = 1;
      }
    }
    else {
LAB_0069ce50:
      if (1 < uVar50 + uVar46) goto LAB_0069d60b;
    }
    local_e8 = (TCGContext_conflict1 *)CONCAT44(local_e8._4_4_,uVar43);
    uVar45 = (uint)((ulong)local_d0 >> 5) & 0x1f;
    uVar48 = uVar48 & 0x1f;
    pcStack_100 = (code *)0x69ce90;
    local_c0 = (TCGContext_conflict1 *)(ulong)uVar46;
    pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
    pTVar57 = local_d8;
    o_11 = (long)pTVar54 - (long)pTVar29;
    if (((uint)local_d0 >> 0x16 & 1) != 0) {
      pcStack_100 = (code *)0x69cf6c;
      pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar10 & 0x1f);
      pcStack_100 = (code *)0x69cf79;
      pTVar15 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar57,uVar45);
      pcStack_100 = (code *)0x69cf87;
      pTVar36 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar57,uVar48);
      uVar49 = o_11;
      if ((char)local_e8 == '\0') {
        pcStack_100 = (code *)0x69d27f;
        tcg_gen_mulu2_i64_aarch64(pTVar29,(TCGv_i64)o_11,pTVar14,pTVar15,pTVar36);
      }
      else {
        pcStack_100 = (code *)0x69cfae;
        tcg_gen_muls2_i64_aarch64(pTVar29,(TCGv_i64)o_11,pTVar14,pTVar15,pTVar36);
      }
      pTVar54 = (TCGTemp *)((long)&pTVar29->pool_cur + uVar49);
      goto LAB_0069e53d;
    }
    local_c8 = (TCGv_i64)(CONCAT44(local_c8._4_4_,uVar10) & 0xffffffff0000001f);
    pcStack_100 = (code *)0x69cec3;
    pTVar20 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
    local_e0 = (code *)((long)pTVar20 - (long)pTVar29);
    pcStack_100 = (code *)0x69cedf;
    pTVar18 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
    pcStack_100 = (code *)0x69cef0;
    pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar45);
    uVar49 = o_11;
    if (uVar50 < 0x42) {
      if (pTVar14 != (TCGv_i64)o_11) {
        pcStack_100 = (code *)0x69cf1f;
        tcg_gen_op2_aarch64(pTVar29,INDEX_op_mov_i64,(TCGArg)pTVar54,
                            (TCGArg)(pTVar14 + (long)pTVar29));
      }
      pcStack_100 = (code *)0x69cf2c;
      pTVar57 = (TCGContext_conflict1 *)cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar48);
      if (pTVar57 != (TCGContext_conflict1 *)local_e0) {
        pcStack_100 = (code *)0x69cf54;
        tcg_gen_op2_aarch64(pTVar29,INDEX_op_mov_i64,(TCGArg)pTVar20,
                            (long)&pTVar29->pool_cur + (long)&pTVar57->pool_cur);
      }
    }
    else if ((char)local_e8 == '\0') {
      pcStack_100 = (code *)0x69d6d1;
      tcg_gen_ext32u_i64_aarch64(pTVar29,(TCGv_i64)o_11,pTVar14);
      pcStack_100 = (code *)0x69d6de;
      pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar48);
      pcStack_100 = (code *)0x69d6ee;
      tcg_gen_ext32u_i64_aarch64(pTVar29,(TCGv_i64)local_e0,pTVar14);
    }
    else {
      pcStack_100 = (code *)0x69d241;
      tcg_gen_ext32s_i64_aarch64(pTVar29,(TCGv_i64)o_11,pTVar14);
      pcStack_100 = (code *)0x69d24e;
      pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar48);
      pcStack_100 = (code *)0x69d25e;
      tcg_gen_ext32s_i64_aarch64(pTVar29,(TCGv_i64)local_e0,pTVar14);
    }
    pTVar53 = (TCGContext_conflict1 *)((long)pTVar18 - (long)pTVar29);
    iVar52 = (int)local_c0;
    if ((uVar11 & 0x1f) == 0x1f && iVar52 == 0) {
      iVar52 = (int)local_c8;
      pcStack_100 = (code *)0x69d76a;
      pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,(int)local_c8);
      pcStack_100 = (code *)0x69d785;
      tcg_gen_op3_aarch64(pTVar29,INDEX_op_mul_i64,(TCGArg)(pTVar14 + (long)pTVar29),(TCGArg)pTVar54
                          ,(TCGArg)pTVar20);
    }
    else {
      pcStack_100 = (code *)0x69d724;
      tcg_gen_op3_aarch64(pTVar29,INDEX_op_mul_i64,(TCGArg)pTVar18,(TCGArg)pTVar54,(TCGArg)pTVar20);
      pTVar57 = local_d8;
      pcStack_100 = (code *)0x69d735;
      pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,(int)local_c8);
      pcStack_100 = (code *)0x69d742;
      pTVar15 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar57,uVar11 & 0x1f);
      if (iVar52 == 0) {
        pcStack_100 = (code *)0x69d7a5;
        tcg_gen_op3_aarch64(pTVar29,INDEX_op_add_i64,(TCGArg)(pTVar14 + (long)pTVar29),
                            (TCGArg)(pTVar15 + (long)pTVar29),(TCGArg)pTVar18);
      }
      else {
        pcStack_100 = (code *)0x69d758;
        tcg_gen_sub_i64(pTVar29,pTVar14,pTVar15,(TCGv_i64)pTVar53);
      }
      uVar49 = o_11;
      iVar52 = (int)local_c8;
    }
    pTVar57 = local_d8;
    if (-1 < (int)(uint)local_d0) {
      pcStack_100 = (code *)0x69d7c4;
      pTVar14 = cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,iVar52);
      pcStack_100 = (code *)0x69d7d1;
      pTVar15 = cpu_reg_aarch64((DisasContext_conflict1 *)pTVar57,iVar52);
      pcStack_100 = (code *)0x69d7df;
      tcg_gen_ext32u_i64_aarch64(pTVar29,pTVar14,pTVar15);
    }
    pcStack_100 = (code *)0x69d7ed;
    tcg_temp_free_internal_aarch64(pTVar29,(TCGTemp *)((long)&pTVar29->pool_cur + uVar49));
    pTVar54 = (TCGTemp *)
              ((long)&pTVar29->pool_cur + (long)&((TCGContext_conflict1 *)local_e0)->pool_cur);
LAB_0069d7f8:
    pcStack_100 = (code *)0x69d7fd;
    tcg_temp_free_internal_aarch64(pTVar29,pTVar54);
    goto LAB_0069e534;
  }
  pTVar29 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
  uVar48 = (uint)((ulong)local_d0 >> 0x1f) & 1;
  uVar11 = (uint)((ulong)local_d0 >> 5) & 0x1f;
  uVar45 = uVar10 & 0x1f;
  uVar46 = (uint)((ulong)local_d0 >> 9) & 0xffe;
  switch(uVar46 + uVar48) {
  case 0x81:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x69e0c4;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      args[0] = (TCGTemp *)(pTVar29->cpu_env + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_pacia_aarch64;
LAB_006a109b:
      iVar52 = 3;
LAB_006a10a3:
      pcStack_100 = (code *)0x6a10a8;
      tcg_gen_callN_aarch64(pTVar29,pcVar44,pTVar54,iVar52,args);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    }
    goto LAB_006a10ad;
  case 0x82:
  case 0x84:
  case 0x86:
  case 0x88:
  case 0x8a:
  case 0x8c:
  case 0x8e:
  case 0x90:
  case 0x92:
  case 0x94:
  case 0x96:
  case 0x98:
  case 0x9a:
  case 0x9c:
  case 0x9e:
  case 0xa0:
  case 0xa2:
    break;
  case 0x83:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x6a1000;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      args[0] = (TCGTemp *)(pTVar29->cpu_env + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_pacib_aarch64;
      goto LAB_006a109b;
    }
    goto LAB_006a10ad;
  case 0x85:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x6a0f3c;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      args[0] = (TCGTemp *)(pTVar29->cpu_env + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_pacda_aarch64;
      goto LAB_006a109b;
    }
    goto LAB_006a10ad;
  case 0x87:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x6a105b;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      args[0] = (TCGTemp *)(pTVar29->cpu_env + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_pacdb_aarch64;
      goto LAB_006a109b;
    }
    goto LAB_006a10ad;
  case 0x89:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x6a0e70;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      args[0] = (TCGTemp *)(pTVar29->cpu_env + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_autia_aarch64;
      goto LAB_006a109b;
    }
    goto LAB_006a10ad;
  case 0x8b:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x6a0f9e;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      args[0] = (TCGTemp *)(pTVar29->cpu_env + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_autib_aarch64;
      goto LAB_006a109b;
    }
    goto LAB_006a10ad;
  case 0x8d:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x6a0da4;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      args[0] = (TCGTemp *)(pTVar29->cpu_env + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_autda_aarch64;
      goto LAB_006a109b;
    }
    goto LAB_006a10ad;
  case 0x8f:
    if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) == '\x01') {
      pcStack_100 = (code *)0x6a0c6e;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      args[0] = (TCGTemp *)(pTVar29->cpu_env + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_autdb_aarch64;
      goto LAB_006a109b;
    }
LAB_006a10ad:
    puVar27 = auStack_f8;
    if ((*(uint *)(lVar58 + 0x50) & 0xff000ff0) != 0) goto LAB_006a0109;
    break;
  case 0x91:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a1161;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcStack_100 = (code *)0x6a1176;
      new_tmp_a64_zero_aarch64(s);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_pacia_aarch64;
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
LAB_006a1256:
      pcStack_100 = (code *)0x6a1266;
      tcg_gen_callN_aarch64(pTVar29,pcVar44,pTVar54,3,args);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    }
    break;
  case 0x93:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a0e1c;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcStack_100 = (code *)0x6a0e31;
      new_tmp_a64_zero_aarch64(s);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_pacib_aarch64;
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
      goto LAB_006a1256;
    }
    break;
  case 0x95:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a1224;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcStack_100 = (code *)0x6a1239;
      new_tmp_a64_zero_aarch64(s);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_pacda_aarch64;
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
      goto LAB_006a1256;
    }
    break;
  case 0x97:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a0ee8;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcStack_100 = (code *)0x6a0efd;
      new_tmp_a64_zero_aarch64(s);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_pacdb_aarch64;
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
      goto LAB_006a1256;
    }
    break;
  case 0x99:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a10f7;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcStack_100 = (code *)0x6a110c;
      new_tmp_a64_zero_aarch64(s);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_autia_aarch64;
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
      goto LAB_006a1256;
    }
    break;
  case 0x9b:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a0ce6;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcStack_100 = (code *)0x6a0cfb;
      new_tmp_a64_zero_aarch64(s);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_autib_aarch64;
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
      goto LAB_006a1256;
    }
    break;
  case 0x9d:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a0d50;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcStack_100 = (code *)0x6a0d65;
      new_tmp_a64_zero_aarch64(s);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_autda_aarch64;
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
      goto LAB_006a1256;
    }
    break;
  case 0x9f:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a0c1a;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcStack_100 = (code *)0x6a0c2f;
      new_tmp_a64_zero_aarch64(s);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      pcVar44 = helper_autdb_aarch64;
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
      goto LAB_006a1256;
    }
    break;
  case 0xa1:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a11cb;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcVar44 = helper_xpaci_aarch64;
LAB_006a12bf:
      args[0] = (TCGTemp *)(pTVar6 + (long)pTVar29);
      pTVar54 = (TCGTemp *)(pTVar14 + (long)pTVar29);
      iVar52 = 2;
      goto LAB_006a10a3;
    }
    break;
  case 0xa3:
    if ((uVar11 == 0x1f) && ((*(ulong *)(lVar58 + 0x50) & 0xff000ff0) != 0)) {
      puVar27 = auStack_f8;
      if (*(char *)((long)&((TCGContext_conflict1 *)s)->initial_buffer_size + 5) != '\x01')
      goto LAB_006a0109;
      pcStack_100 = (code *)0x6a129e;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pTVar6 = pTVar29->cpu_env;
      pcVar44 = helper_xpacd_aarch64;
      goto LAB_006a12bf;
    }
    break;
  default:
    switch(uVar46 | uVar48) {
    case 0:
    case 1:
      pcStack_100 = (code *)0x69fb76;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pcStack_100 = (code *)0x69fb83;
      pTVar15 = cpu_reg_aarch64(s,uVar11);
      if ((int)uVar10 < 0) {
        args[0] = (TCGTemp *)(pTVar15 + (long)pTVar29);
        pcStack_100 = (code *)0x6a13b7;
        tcg_gen_callN_aarch64
                  (pTVar29,helper_rbit64_aarch64,(TCGTemp *)(pTVar14 + (long)pTVar29),1,args);
        puVar27 = auStack_f8;
        s = (DisasContext_conflict1 *)local_d8;
        goto LAB_006a0109;
      }
      pcStack_100 = (code *)0x69fb9b;
      pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
      pTVar13 = (TCGv_i32)((long)pTVar54 - (long)pTVar29);
      pcStack_100 = (code *)0x69fbb2;
      tcg_gen_extrl_i64_i32_aarch64(pTVar29,pTVar13,pTVar15);
      pcStack_100 = (code *)0x69fbd1;
      args[0] = pTVar54;
      tcg_gen_callN_aarch64(pTVar29,helper_rbit_aarch64,pTVar54,1,args);
      break;
    case 2:
    case 3:
      pcStack_100 = (code *)0x6a0a91;
      o_11 = (uintptr_t)cpu_reg_aarch64(s,uVar45);
      pcStack_100 = (code *)0x6a0aa5;
      pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false);
      pcStack_100 = (code *)0x6a0abd;
      pTVar14 = read_cpu_reg_aarch64((DisasContext_conflict1 *)local_d8,uVar11,uVar48);
      val_01 = 0xff00ff00ff00ff;
      if (-1 < (int)uVar10) {
        val_01 = 0xff00ff;
      }
      pcStack_100 = (code *)0x6a0ade;
      pTVar15 = tcg_const_i64_aarch64(pTVar29,val_01);
      pcStack_100 = (code *)0x6a0af4;
      tcg_gen_shri_i64_aarch64(pTVar29,(TCGv_i64)((long)pTVar54 - (long)pTVar29),pTVar14,8);
      uVar49 = o_11;
      TVar28 = (long)&pTVar29->pool_cur + o_11;
      pTVar20 = (TCGTemp *)(pTVar15 + (long)pTVar29);
      pcStack_100 = (code *)0x6a0b19;
      tcg_gen_op3_aarch64(pTVar29,INDEX_op_and_i64,TVar28,(TCGArg)(pTVar14 + (long)pTVar29),
                          (TCGArg)pTVar20);
      pcStack_100 = (code *)0x6a0b2f;
      tcg_gen_op3_aarch64(pTVar29,INDEX_op_and_i64,(TCGArg)pTVar54,(TCGArg)pTVar54,(TCGArg)pTVar20);
      pcStack_100 = (code *)0x6a0b42;
      tcg_gen_shli_i64_aarch64(pTVar29,(TCGv_i64)uVar49,(TCGv_i64)uVar49,8);
      pcStack_100 = (code *)0x6a0b58;
      tcg_gen_op3_aarch64(pTVar29,INDEX_op_or_i64,TVar28,TVar28,(TCGArg)pTVar54);
      pcStack_100 = (code *)0x6a0b63;
      tcg_temp_free_internal_aarch64(pTVar29,pTVar20);
      goto LAB_0069e53d;
    case 4:
    case 5:
      pcStack_100 = (code *)0x6a09cf;
      o_11 = (uintptr_t)cpu_reg_aarch64(s,uVar45);
      if ((int)uVar10 < 0) {
        pcStack_100 = (code *)0x6a1303;
        local_d0 = (TCGContext_conflict1 *)tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I64,false)
        ;
        pTVar15 = (TCGv_i64)((long)local_d0 - (long)pTVar29);
        pcStack_100 = (code *)0x6a131e;
        pTVar14 = read_cpu_reg_aarch64(s,uVar11,uVar48);
        pcStack_100 = (code *)0x6a132f;
        tcg_gen_ext32u_i64_aarch64(pTVar29,pTVar15,pTVar14);
        uVar49 = o_11;
        pcStack_100 = (code *)0x6a1342;
        tcg_gen_bswap32_i64_aarch64(pTVar29,(TCGv_i64)o_11,pTVar15);
        pcStack_100 = (code *)0x6a1355;
        tcg_gen_shri_i64_aarch64(pTVar29,pTVar15,pTVar14,0x20);
        pcStack_100 = (code *)0x6a1363;
        tcg_gen_bswap32_i64_aarch64(pTVar29,pTVar15,pTVar15);
        pcStack_100 = (code *)0x6a1380;
        tcg_gen_deposit_i64_aarch64(pTVar29,(TCGv_i64)uVar49,(TCGv_i64)uVar49,pTVar15,0x20,0x20);
        pcStack_100 = (code *)0x6a138d;
        tcg_temp_free_internal_aarch64(pTVar29,(TCGTemp *)local_d0);
        puVar27 = auStack_f8;
      }
      else {
        pcStack_100 = (code *)0x6a09ea;
        pTVar14 = cpu_reg_aarch64(s,uVar11);
        uVar49 = o_11;
        pcStack_100 = (code *)0x6a09fd;
        tcg_gen_ext32u_i64_aarch64(pTVar29,(TCGv_i64)o_11,pTVar14);
        pcStack_100 = (code *)0x6a0a0b;
        tcg_gen_bswap32_i64_aarch64(pTVar29,(TCGv_i64)uVar49,(TCGv_i64)uVar49);
        puVar27 = auStack_f8;
      }
      goto LAB_006a0109;
    default:
      goto switchD_0069e0a5_caseD_82;
    case 7:
      pcStack_100 = (code *)0x6a12dc;
      handle_rev64(s,uVar48,uVar11,uVar45);
      puVar27 = auStack_f8;
      goto LAB_006a0109;
    case 8:
    case 9:
      pcStack_100 = (code *)0x6a0a20;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pcStack_100 = (code *)0x6a0a2d;
      pTVar15 = cpu_reg_aarch64(s,uVar11);
      if ((int)uVar10 < 0) {
        pcStack_100 = (code *)0x6a13cf;
        tcg_gen_clzi_i64_aarch64(pTVar29,pTVar14,pTVar15,0x40);
        puVar27 = auStack_f8;
        s = (DisasContext_conflict1 *)local_d8;
        goto LAB_006a0109;
      }
      pcStack_100 = (code *)0x6a0a45;
      pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
      pTVar13 = (TCGv_i32)((long)pTVar54 - (long)pTVar29);
      pcStack_100 = (code *)0x6a0a5c;
      tcg_gen_extrl_i64_i32_aarch64(pTVar29,pTVar13,pTVar15);
      pcStack_100 = (code *)0x6a0a6f;
      tcg_gen_clzi_i32_aarch64(pTVar29,pTVar13,pTVar13,0x20);
      break;
    case 10:
    case 0xb:
      pcStack_100 = (code *)0x6a0970;
      pTVar14 = cpu_reg_aarch64(s,uVar45);
      pcStack_100 = (code *)0x6a097d;
      pTVar15 = cpu_reg_aarch64(s,uVar11);
      if ((int)uVar10 < 0) {
        pcStack_100 = (code *)0x6a12ef;
        tcg_gen_clrsb_i64_aarch64(pTVar29,pTVar14,pTVar15);
        puVar27 = auStack_f8;
        s = (DisasContext_conflict1 *)local_d8;
        goto LAB_006a0109;
      }
      pcStack_100 = (code *)0x6a0995;
      pTVar54 = tcg_temp_new_internal_aarch64(pTVar29,TCG_TYPE_I32,false);
      pTVar13 = (TCGv_i32)((long)pTVar54 - (long)pTVar29);
      pcStack_100 = (code *)0x6a09ac;
      tcg_gen_extrl_i64_i32_aarch64(pTVar29,pTVar13,pTVar15);
      pcStack_100 = (code *)0x6a09ba;
      tcg_gen_clrsb_i32_aarch64(pTVar29,pTVar13,pTVar13);
    }
    pcStack_100 = (code *)0x6a0a7d;
    tcg_gen_extu_i32_i64_aarch64(pTVar29,pTVar14,pTVar13);
LAB_0069e53d:
    pcStack_100 = (code *)0x69e542;
    tcg_temp_free_internal_aarch64(pTVar29,pTVar54);
    puVar27 = auStack_f8;
    s = (DisasContext_conflict1 *)local_d8;
    goto LAB_006a0109;
  }
switchD_0069e0a5_caseD_82:
LAB_0069d60b:
  pcStack_100 = (code *)0x69d610;
  unallocated_encoding_aarch64(s);
  puVar27 = auStack_f8;
LAB_006a0109:
  if (0 < *(int *)&((TCGContext_conflict1 *)s)->data_gen_ptr) {
    pTVar57 = *(TCGContext_conflict1 **)(((TCGContext_conflict1 *)s)->free_temps[1].l[1] + 0x2e8);
    lVar58 = 0;
    do {
      uVar5 = ((TCGContext_conflict1 *)s)->free_temps[0].l[lVar58 + -7];
      *(undefined8 *)(puVar27 + -8) = 0x6a013a;
      tcg_temp_free_internal_aarch64(pTVar57,(TCGTemp *)((long)&pTVar57->pool_cur + uVar5));
      lVar58 = lVar58 + 1;
    } while (lVar58 < *(int *)&((TCGContext_conflict1 *)s)->data_gen_ptr);
  }
  *(undefined4 *)&((TCGContext_conflict1 *)s)->data_gen_ptr = 0;
  if (('\0' < (char)((TCGContext_conflict1 *)s)->code_gen_buffer_size) &&
     (*(int *)&((TCGContext_conflict1 *)s)->pool_current != 2)) {
    *(undefined8 *)(puVar27 + -8) = 0x6a016d;
    reset_btype(s);
  }
  return;
switchD_0069bff9_caseD_1:
  s = (DisasContext_conflict1 *)local_d8;
  goto LAB_0069d60b;
switchD_0069d1d9_caseD_9:
  pcStack_100 = (code *)0x69f004;
  unallocated_encoding_aarch64(s);
  puVar27 = auStack_f8;
  goto LAB_006a0109;
}

Assistant:

static void disas_a64_insn(CPUARMState *env, DisasContext *s)
{
    uint32_t insn;

    s->pc_curr = s->base.pc_next;
    insn = arm_ldl_code(env, s->base.pc_next, s->sctlr_b);

    s->insn = insn;
    s->base.pc_next += 4;

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(env->uc, UC_HOOK_CODE, s->pc_curr)) {

        // Sync PC in advance
        TCGContext *tcg_ctx = env->uc->tcg_ctx;
        gen_a64_set_pc_im(tcg_ctx, s->pc_curr);

        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, env->uc, s->pc_curr);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    s->fp_access_checked = false;

    if (dc_isar_feature(aa64_bti, s)) {
        if (s->base.num_insns == 1) {
            /*
             * At the first insn of the TB, compute s->guarded_page.
             * We delayed computing this until successfully reading
             * the first insn of the TB, above.  This (mostly) ensures
             * that the softmmu tlb entry has been populated, and the
             * page table GP bit is available.
             *
             * Note that we need to compute this even if btype == 0,
             * because this value is used for BR instructions later
             * where ENV is not available.
             */
            s->guarded_page = is_guarded_page(env, s);

            /* First insn can have btype set to non-zero.  */
            tcg_debug_assert(s->btype >= 0);

            /*
             * Note that the Branch Target Exception has fairly high
             * priority -- below debugging exceptions but above most
             * everything else.  This allows us to handle this now
             * instead of waiting until the insn is otherwise decoded.
             */
            if (s->btype != 0
                && s->guarded_page
                && !btype_destination_ok(insn, s->bt, s->btype)) {
                gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                                   syn_btitrap(s->btype),
                                   default_exception_el(s));
                return;
            }
        } else {
            /* Not the first insn: btype must be 0.  */
            tcg_debug_assert(s->btype == 0);
        }
    }

    switch (extract32(insn, 25, 4)) {
    case 0x0: case 0x1: case 0x3: /* UNALLOCATED */
        unallocated_encoding(s);
        break;
    case 0x2:
        if (!dc_isar_feature(aa64_sve, s) || !disas_sve(s, insn)) {
            unallocated_encoding(s);
        }
        break;
    case 0x8: case 0x9: /* Data processing - immediate */
        disas_data_proc_imm(s, insn);
        break;
    case 0xa: case 0xb: /* Branch, exception generation and system insns */
        disas_b_exc_sys(s, insn);
        break;
    case 0x4:
    case 0x6:
    case 0xc:
    case 0xe:      /* Loads and stores */
        disas_ldst(s, insn);
        break;
    case 0x5:
    case 0xd:      /* Data processing - register */
        disas_data_proc_reg(s, insn);
        break;
    case 0x7:
    case 0xf:      /* Data processing - SIMD and floating point */
        disas_data_proc_simd_fp(s, insn);
        break;
    default:
        assert(FALSE); /* all 15 cases should be handled above */
        break;
    }

    /* if we allocated any temporaries, free them here */
    free_tmp_a64(s);

    /*
     * After execution of most insns, btype is reset to 0.
     * Note that we set btype == -1 when the insn sets btype.
     */
    if (s->btype > 0 && s->base.is_jmp != DISAS_NORETURN) {
        reset_btype(s);
    }
}